

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<8>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  uint uVar59;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  float t1;
  float fVar68;
  undefined4 uVar69;
  float fVar70;
  float fVar96;
  float fVar98;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar97;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined8 uVar99;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vfloat4 b0;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  float fVar152;
  float fVar153;
  float fVar171;
  float fVar172;
  vfloat4 b0_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar173;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar188;
  float fVar203;
  float fVar204;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar205;
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  vfloat4 a0_2;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar227;
  vfloat4 a0_3;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar239 [64];
  vfloat4 a0_1;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  float fVar248;
  vfloat4 a0;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar259;
  float fVar260;
  undefined1 in_ZMM12 [64];
  float fVar261;
  undefined1 auVar258 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar285 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_51c;
  undefined1 local_518 [16];
  undefined1 local_508 [8];
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  ulong local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 auStack_338 [16];
  undefined1 local_328 [32];
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2bc;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  uint uStack_1b8;
  float afStack_1b4 [7];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar284 [32];
  
  PVar7 = prim[1];
  uVar66 = (ulong)(byte)PVar7;
  fVar68 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar71._0_4_ = fVar68 * auVar12._0_4_;
  auVar71._4_4_ = fVar68 * auVar12._4_4_;
  auVar71._8_4_ = fVar68 * auVar12._8_4_;
  auVar71._12_4_ = fVar68 * auVar12._12_4_;
  auVar189._0_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar189._4_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar189._8_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar189._12_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar12);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar13 = vpmovsxbd_avx2(auVar4);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar14 = vpmovsxbd_avx2(auVar136);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar15 = vpmovsxbd_avx2(auVar5);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar16 = vpmovsxbd_avx2(auVar6);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar66 + 6);
  auVar17 = vpmovsxbd_avx2(auVar251);
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar60 = (ulong)(uint)((int)(uVar66 * 9) * 2);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar18 = vpmovsxbd_avx2(auVar160);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar60 + uVar66 + 6);
  auVar257 = vpmovsxbd_avx2(auVar135);
  auVar257 = vcvtdq2ps_avx(auVar257);
  uVar60 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar242._8_8_ = 0;
  auVar242._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar19 = vpmovsxbd_avx2(auVar242);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar274._4_4_ = auVar189._0_4_;
  auVar274._0_4_ = auVar189._0_4_;
  auVar274._8_4_ = auVar189._0_4_;
  auVar274._12_4_ = auVar189._0_4_;
  auVar274._16_4_ = auVar189._0_4_;
  auVar274._20_4_ = auVar189._0_4_;
  auVar274._24_4_ = auVar189._0_4_;
  auVar274._28_4_ = auVar189._0_4_;
  auVar12 = vmovshdup_avx(auVar189);
  uVar99 = auVar12._0_8_;
  auVar282._8_8_ = uVar99;
  auVar282._0_8_ = uVar99;
  auVar282._16_8_ = uVar99;
  auVar282._24_8_ = uVar99;
  auVar12 = vshufps_avx(auVar189,auVar189,0xaa);
  fVar68 = auVar12._0_4_;
  auVar170._0_4_ = fVar68 * auVar14._0_4_;
  fVar96 = auVar12._4_4_;
  auVar170._4_4_ = fVar96 * auVar14._4_4_;
  auVar170._8_4_ = fVar68 * auVar14._8_4_;
  auVar170._12_4_ = fVar96 * auVar14._12_4_;
  auVar170._16_4_ = fVar68 * auVar14._16_4_;
  auVar170._20_4_ = fVar96 * auVar14._20_4_;
  auVar170._28_36_ = in_ZMM12._28_36_;
  auVar170._24_4_ = fVar68 * auVar14._24_4_;
  auVar151._0_4_ = auVar17._0_4_ * fVar68;
  auVar151._4_4_ = auVar17._4_4_ * fVar96;
  auVar151._8_4_ = auVar17._8_4_ * fVar68;
  auVar151._12_4_ = auVar17._12_4_ * fVar96;
  auVar151._16_4_ = auVar17._16_4_ * fVar68;
  auVar151._20_4_ = auVar17._20_4_ * fVar96;
  auVar151._28_36_ = in_ZMM10._28_36_;
  auVar151._24_4_ = auVar17._24_4_ * fVar68;
  auVar224._0_4_ = auVar19._0_4_ * fVar68;
  auVar224._4_4_ = auVar19._4_4_ * fVar96;
  auVar224._8_4_ = auVar19._8_4_ * fVar68;
  auVar224._12_4_ = auVar19._12_4_ * fVar96;
  auVar224._16_4_ = auVar19._16_4_ * fVar68;
  auVar224._20_4_ = auVar19._20_4_ * fVar96;
  auVar224._24_4_ = auVar19._24_4_ * fVar68;
  auVar224._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(auVar170._0_32_,auVar282,auVar13);
  auVar4 = vfmadd231ps_fma(auVar151._0_32_,auVar282,auVar16);
  auVar136 = vfmadd231ps_fma(auVar224,auVar257,auVar282);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar274,auVar92);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar274,auVar15);
  auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar18,auVar274);
  auVar275._4_4_ = auVar71._0_4_;
  auVar275._0_4_ = auVar71._0_4_;
  auVar275._8_4_ = auVar71._0_4_;
  auVar275._12_4_ = auVar71._0_4_;
  auVar275._16_4_ = auVar71._0_4_;
  auVar275._20_4_ = auVar71._0_4_;
  auVar275._24_4_ = auVar71._0_4_;
  auVar275._28_4_ = auVar71._0_4_;
  auVar12 = vmovshdup_avx(auVar71);
  uVar99 = auVar12._0_8_;
  auVar283._8_8_ = uVar99;
  auVar283._0_8_ = uVar99;
  auVar283._16_8_ = uVar99;
  auVar283._24_8_ = uVar99;
  auVar12 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar68 = auVar12._0_4_;
  auVar197._0_4_ = fVar68 * auVar14._0_4_;
  fVar96 = auVar12._4_4_;
  auVar197._4_4_ = fVar96 * auVar14._4_4_;
  auVar197._8_4_ = fVar68 * auVar14._8_4_;
  auVar197._12_4_ = fVar96 * auVar14._12_4_;
  auVar197._16_4_ = fVar68 * auVar14._16_4_;
  auVar197._20_4_ = fVar96 * auVar14._20_4_;
  auVar197._24_4_ = fVar68 * auVar14._24_4_;
  auVar197._28_4_ = 0;
  auVar22._4_4_ = auVar17._4_4_ * fVar96;
  auVar22._0_4_ = auVar17._0_4_ * fVar68;
  auVar22._8_4_ = auVar17._8_4_ * fVar68;
  auVar22._12_4_ = auVar17._12_4_ * fVar96;
  auVar22._16_4_ = auVar17._16_4_ * fVar68;
  auVar22._20_4_ = auVar17._20_4_ * fVar96;
  auVar22._24_4_ = auVar17._24_4_ * fVar68;
  auVar22._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = auVar19._4_4_ * fVar96;
  auVar14._0_4_ = auVar19._0_4_ * fVar68;
  auVar14._8_4_ = auVar19._8_4_ * fVar68;
  auVar14._12_4_ = auVar19._12_4_ * fVar96;
  auVar14._16_4_ = auVar19._16_4_ * fVar68;
  auVar14._20_4_ = auVar19._20_4_ * fVar96;
  auVar14._24_4_ = auVar19._24_4_ * fVar68;
  auVar14._28_4_ = fVar96;
  auVar12 = vfmadd231ps_fma(auVar197,auVar283,auVar13);
  auVar6 = vfmadd231ps_fma(auVar22,auVar283,auVar16);
  auVar251 = vfmadd231ps_fma(auVar14,auVar283,auVar257);
  auVar160 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar275,auVar92);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar275,auVar15);
  auVar127._8_4_ = 0x7fffffff;
  auVar127._0_8_ = 0x7fffffff7fffffff;
  auVar127._12_4_ = 0x7fffffff;
  auVar127._16_4_ = 0x7fffffff;
  auVar127._20_4_ = 0x7fffffff;
  auVar127._24_4_ = 0x7fffffff;
  auVar127._28_4_ = 0x7fffffff;
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  auVar149._16_4_ = 0x219392ef;
  auVar149._20_4_ = 0x219392ef;
  auVar149._24_4_ = 0x219392ef;
  auVar149._28_4_ = 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar5),auVar127);
  auVar92 = vcmpps_avx(auVar92,auVar149,1);
  auVar13 = vblendvps_avx(ZEXT1632(auVar5),auVar149,auVar92);
  auVar92 = vandps_avx(ZEXT1632(auVar4),auVar127);
  auVar92 = vcmpps_avx(auVar92,auVar149,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar4),auVar149,auVar92);
  auVar92 = vandps_avx(ZEXT1632(auVar136),auVar127);
  auVar92 = vcmpps_avx(auVar92,auVar149,1);
  auVar92 = vblendvps_avx(ZEXT1632(auVar136),auVar149,auVar92);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar251),auVar275,auVar18);
  auVar15 = vrcpps_avx(auVar13);
  auVar168._8_4_ = 0x3f800000;
  auVar168._0_8_ = 0x3f8000003f800000;
  auVar168._12_4_ = 0x3f800000;
  auVar168._16_4_ = 0x3f800000;
  auVar168._20_4_ = 0x3f800000;
  auVar168._24_4_ = 0x3f800000;
  auVar168._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar13,auVar15,auVar168);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar4 = vfnmadd213ps_fma(auVar14,auVar13,auVar168);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar92);
  auVar136 = vfnmadd213ps_fma(auVar92,auVar13,auVar168);
  auVar136 = vfmadd132ps_fma(ZEXT1632(auVar136),auVar13,auVar13);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar160));
  auVar15._4_4_ = auVar12._4_4_ * auVar92._4_4_;
  auVar15._0_4_ = auVar12._0_4_ * auVar92._0_4_;
  auVar15._8_4_ = auVar12._8_4_ * auVar92._8_4_;
  auVar15._12_4_ = auVar12._12_4_ * auVar92._12_4_;
  auVar15._16_4_ = auVar92._16_4_ * 0.0;
  auVar15._20_4_ = auVar92._20_4_ * 0.0;
  auVar15._24_4_ = auVar92._24_4_ * 0.0;
  auVar15._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar160));
  auVar16._4_4_ = auVar12._4_4_ * auVar92._4_4_;
  auVar16._0_4_ = auVar12._0_4_ * auVar92._0_4_;
  auVar16._8_4_ = auVar12._8_4_ * auVar92._8_4_;
  auVar16._12_4_ = auVar12._12_4_ * auVar92._12_4_;
  auVar16._16_4_ = auVar92._16_4_ * 0.0;
  auVar16._20_4_ = auVar92._20_4_ * 0.0;
  auVar16._24_4_ = auVar92._24_4_ * 0.0;
  auVar16._28_4_ = auVar92._28_4_;
  auVar112._1_3_ = 0;
  auVar112[0] = PVar7;
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar66 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar6));
  auVar17._4_4_ = auVar92._4_4_ * auVar4._4_4_;
  auVar17._0_4_ = auVar92._0_4_ * auVar4._0_4_;
  auVar17._8_4_ = auVar92._8_4_ * auVar4._8_4_;
  auVar17._12_4_ = auVar92._12_4_ * auVar4._12_4_;
  auVar17._16_4_ = auVar92._16_4_ * 0.0;
  auVar17._20_4_ = auVar92._20_4_ * 0.0;
  auVar17._24_4_ = auVar92._24_4_ * 0.0;
  auVar17._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar13);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar6));
  auVar18._4_4_ = auVar4._4_4_ * auVar92._4_4_;
  auVar18._0_4_ = auVar4._0_4_ * auVar92._0_4_;
  auVar18._8_4_ = auVar4._8_4_ * auVar92._8_4_;
  auVar18._12_4_ = auVar4._12_4_ * auVar92._12_4_;
  auVar18._16_4_ = auVar92._16_4_ * 0.0;
  auVar18._20_4_ = auVar92._20_4_ * 0.0;
  auVar18._24_4_ = auVar92._24_4_ * 0.0;
  auVar18._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 + uVar66 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar5));
  auVar257._4_4_ = auVar92._4_4_ * auVar136._4_4_;
  auVar257._0_4_ = auVar92._0_4_ * auVar136._0_4_;
  auVar257._8_4_ = auVar92._8_4_ * auVar136._8_4_;
  auVar257._12_4_ = auVar92._12_4_ * auVar136._12_4_;
  auVar257._16_4_ = auVar92._16_4_ * 0.0;
  auVar257._20_4_ = auVar92._20_4_ * 0.0;
  auVar257._24_4_ = auVar92._24_4_ * 0.0;
  auVar257._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar5));
  auVar19._4_4_ = auVar136._4_4_ * auVar92._4_4_;
  auVar19._0_4_ = auVar136._0_4_ * auVar92._0_4_;
  auVar19._8_4_ = auVar136._8_4_ * auVar92._8_4_;
  auVar19._12_4_ = auVar136._12_4_ * auVar92._12_4_;
  auVar19._16_4_ = auVar92._16_4_ * 0.0;
  auVar19._20_4_ = auVar92._20_4_ * 0.0;
  auVar19._24_4_ = auVar92._24_4_ * 0.0;
  auVar19._28_4_ = auVar92._28_4_;
  auVar92 = vpminsd_avx2(auVar15,auVar16);
  auVar13 = vpminsd_avx2(auVar17,auVar18);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  uVar69 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar198._4_4_ = uVar69;
  auVar198._0_4_ = uVar69;
  auVar198._8_4_ = uVar69;
  auVar198._12_4_ = uVar69;
  auVar198._16_4_ = uVar69;
  auVar198._20_4_ = uVar69;
  auVar198._24_4_ = uVar69;
  auVar198._28_4_ = uVar69;
  auVar13 = vpminsd_avx2(auVar257,auVar19);
  auVar13 = vmaxps_avx(auVar13,auVar198);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  local_198._4_4_ = auVar92._4_4_ * 0.99999964;
  local_198._0_4_ = auVar92._0_4_ * 0.99999964;
  local_198._8_4_ = auVar92._8_4_ * 0.99999964;
  local_198._12_4_ = auVar92._12_4_ * 0.99999964;
  local_198._16_4_ = auVar92._16_4_ * 0.99999964;
  local_198._20_4_ = auVar92._20_4_ * 0.99999964;
  local_198._24_4_ = auVar92._24_4_ * 0.99999964;
  local_198._28_4_ = auVar13._28_4_;
  auVar92 = vpmaxsd_avx2(auVar15,auVar16);
  auVar13 = vpmaxsd_avx2(auVar17,auVar18);
  auVar92 = vminps_avx(auVar92,auVar13);
  auVar13 = vpmaxsd_avx2(auVar257,auVar19);
  fVar68 = (ray->super_RayK<1>).tfar;
  auVar128._4_4_ = fVar68;
  auVar128._0_4_ = fVar68;
  auVar128._8_4_ = fVar68;
  auVar128._12_4_ = fVar68;
  auVar128._16_4_ = fVar68;
  auVar128._20_4_ = fVar68;
  auVar128._24_4_ = fVar68;
  auVar128._28_4_ = fVar68;
  auVar13 = vminps_avx(auVar13,auVar128);
  auVar92 = vminps_avx(auVar92,auVar13);
  auVar23._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar23._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar23._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar23._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar23._16_4_ = auVar92._16_4_ * 1.0000004;
  auVar23._20_4_ = auVar92._20_4_ * 1.0000004;
  auVar23._24_4_ = auVar92._24_4_ * 1.0000004;
  auVar23._28_4_ = auVar92._28_4_;
  auVar112[4] = PVar7;
  auVar112._5_3_ = 0;
  auVar112[8] = PVar7;
  auVar112._9_3_ = 0;
  auVar112[0xc] = PVar7;
  auVar112._13_3_ = 0;
  auVar112[0x10] = PVar7;
  auVar112._17_3_ = 0;
  auVar112[0x14] = PVar7;
  auVar112._21_3_ = 0;
  auVar112[0x18] = PVar7;
  auVar112._25_3_ = 0;
  auVar112[0x1c] = PVar7;
  auVar112._29_3_ = 0;
  auVar13 = vpcmpgtd_avx2(auVar112,_DAT_01fe9900);
  auVar92 = vcmpps_avx(local_198,auVar23,2);
  auVar92 = vandps_avx(auVar92,auVar13);
  uVar59 = vmovmskps_avx(auVar92);
  if (uVar59 == 0) {
    return;
  }
  uVar59 = uVar59 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  local_308 = 0x7fffffff;
  uStack_304 = 0x7fffffff;
  uStack_300 = 0x7fffffff;
  uStack_2fc = 0x7fffffff;
  do {
    lVar61 = 0;
    uVar66 = (ulong)uVar59;
    for (uVar60 = uVar66; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    uVar59 = *(uint *)(prim + 2);
    pGVar8 = (context->scene->geometries).items[uVar59].ptr;
    local_4b0 = (ulong)*(uint *)(prim + lVar61 * 4 + 6);
    uVar60 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(prim + lVar61 * 4 + 6));
    p_Var9 = pGVar8[1].intersectionFilterN;
    pvVar10 = pGVar8[2].userPtr;
    _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar12 = *(undefined1 (*) [16])(_Var11 + uVar60 * (long)pvVar10);
    auVar4 = *(undefined1 (*) [16])(_Var11 + (uVar60 + 1) * (long)pvVar10);
    auVar136 = *(undefined1 (*) [16])(_Var11 + (uVar60 + 2) * (long)pvVar10);
    pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar60 + 3));
    fVar68 = *pfVar1;
    fVar96 = pfVar1[1];
    fVar129 = pfVar1[2];
    fVar97 = pfVar1[3];
    lVar61 = *(long *)&pGVar8[1].time_range.upper;
    auVar5 = *(undefined1 (*) [16])(lVar61 + (long)p_Var9 * uVar60);
    auVar6 = *(undefined1 (*) [16])(lVar61 + (long)p_Var9 * (uVar60 + 1));
    auVar251 = *(undefined1 (*) [16])(lVar61 + (long)p_Var9 * (uVar60 + 2));
    uVar66 = uVar66 - 1 & uVar66;
    pfVar1 = (float *)(lVar61 + (long)p_Var9 * (uVar60 + 3));
    fVar98 = *pfVar1;
    fVar70 = pfVar1[1];
    fVar153 = pfVar1[2];
    fVar227 = pfVar1[3];
    if (uVar66 != 0) {
      uVar67 = uVar66 - 1 & uVar66;
      for (uVar60 = uVar66; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
      if (uVar67 != 0) {
        for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar100._8_4_ = 0x80000000;
    auVar100._0_8_ = 0x8000000080000000;
    auVar100._12_4_ = 0x80000000;
    auVar116._0_4_ = fVar98 * -0.0;
    auVar116._4_4_ = fVar70 * -0.0;
    auVar116._8_4_ = fVar153 * -0.0;
    auVar116._12_4_ = fVar227 * -0.0;
    auVar160 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar251,auVar116);
    auVar72._0_4_ = auVar6._0_4_ + auVar160._0_4_;
    auVar72._4_4_ = auVar6._4_4_ + auVar160._4_4_;
    auVar72._8_4_ = auVar6._8_4_ + auVar160._8_4_;
    auVar72._12_4_ = auVar6._12_4_ + auVar160._12_4_;
    auVar135 = vfmadd231ps_fma(auVar72,auVar5,auVar100);
    auVar270 = ZEXT816(0) << 0x40;
    auVar101._0_4_ = fVar98 * 0.0;
    auVar101._4_4_ = fVar70 * 0.0;
    auVar101._8_4_ = fVar153 * 0.0;
    auVar101._12_4_ = fVar227 * 0.0;
    auVar278._8_4_ = 0x3f000000;
    auVar278._0_8_ = 0x3f0000003f000000;
    auVar278._12_4_ = 0x3f000000;
    auVar160 = vfmadd231ps_fma(auVar101,auVar251,auVar278);
    auVar160 = vfmadd231ps_fma(auVar160,auVar6,auVar270);
    auVar189 = vfnmadd231ps_fma(auVar160,auVar5,auVar278);
    auVar262._0_4_ = fVar68 * -0.0;
    auVar262._4_4_ = fVar96 * -0.0;
    auVar262._8_4_ = fVar129 * -0.0;
    auVar262._12_4_ = fVar97 * -0.0;
    auVar160 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar136,auVar262);
    auVar249._0_4_ = auVar160._0_4_ + auVar4._0_4_;
    auVar249._4_4_ = auVar160._4_4_ + auVar4._4_4_;
    auVar249._8_4_ = auVar160._8_4_ + auVar4._8_4_;
    auVar249._12_4_ = auVar160._12_4_ + auVar4._12_4_;
    auVar160 = vfmadd231ps_fma(auVar249,auVar12,auVar100);
    auVar240._0_4_ = fVar68 * 0.0;
    auVar240._4_4_ = fVar96 * 0.0;
    auVar240._8_4_ = fVar129 * 0.0;
    auVar240._12_4_ = fVar97 * 0.0;
    auVar242 = vfmadd231ps_fma(auVar240,auVar136,auVar278);
    auVar242 = vfmadd231ps_fma(auVar242,auVar4,auVar270);
    auVar132 = vfnmadd231ps_fma(auVar242,auVar12,auVar278);
    auVar117._0_4_ = auVar251._0_4_ + auVar116._0_4_;
    auVar117._4_4_ = auVar251._4_4_ + auVar116._4_4_;
    auVar117._8_4_ = auVar251._8_4_ + auVar116._8_4_;
    auVar117._12_4_ = auVar251._12_4_ + auVar116._12_4_;
    auVar242 = vfmadd231ps_fma(auVar117,auVar6,auVar270);
    auVar242 = vfmadd231ps_fma(auVar242,auVar5,auVar100);
    auVar130._0_4_ = fVar98 * 0.5;
    auVar130._4_4_ = fVar70 * 0.5;
    auVar130._8_4_ = fVar153 * 0.5;
    auVar130._12_4_ = fVar227 * 0.5;
    auVar251 = vfmadd231ps_fma(auVar130,auVar270,auVar251);
    auVar6 = vfnmadd231ps_fma(auVar251,auVar278,auVar6);
    auVar71 = vfmadd231ps_fma(auVar6,auVar270,auVar5);
    auVar206._0_4_ = auVar262._0_4_ + auVar136._0_4_;
    auVar206._4_4_ = auVar262._4_4_ + auVar136._4_4_;
    auVar206._8_4_ = auVar262._8_4_ + auVar136._8_4_;
    auVar206._12_4_ = auVar262._12_4_ + auVar136._12_4_;
    auVar5 = vfmadd231ps_fma(auVar206,auVar4,auVar270);
    auVar6 = vfmadd231ps_fma(auVar5,auVar12,auVar100);
    auVar215._0_4_ = fVar68 * 0.5;
    auVar215._4_4_ = fVar96 * 0.5;
    auVar215._8_4_ = fVar129 * 0.5;
    auVar215._12_4_ = fVar97 * 0.5;
    auVar136 = vfmadd231ps_fma(auVar215,auVar270,auVar136);
    auVar4 = vfnmadd231ps_fma(auVar136,auVar278,auVar4);
    auVar251 = vfmadd231ps_fma(auVar4,auVar270,auVar12);
    auVar12 = vshufps_avx(auVar189,auVar189,0xc9);
    auVar4 = vshufps_avx(auVar160,auVar160,0xc9);
    fVar98 = auVar189._0_4_;
    auVar154._0_4_ = fVar98 * auVar4._0_4_;
    fVar70 = auVar189._4_4_;
    auVar154._4_4_ = fVar70 * auVar4._4_4_;
    fVar153 = auVar189._8_4_;
    auVar154._8_4_ = fVar153 * auVar4._8_4_;
    fVar227 = auVar189._12_4_;
    auVar154._12_4_ = fVar227 * auVar4._12_4_;
    auVar4 = vfmsub231ps_fma(auVar154,auVar12,auVar160);
    auVar136 = vshufps_avx(auVar4,auVar4,0xc9);
    auVar4 = vshufps_avx(auVar132,auVar132,0xc9);
    auVar155._0_4_ = fVar98 * auVar4._0_4_;
    auVar155._4_4_ = fVar70 * auVar4._4_4_;
    auVar155._8_4_ = fVar153 * auVar4._8_4_;
    auVar155._12_4_ = fVar227 * auVar4._12_4_;
    auVar12 = vfmsub231ps_fma(auVar155,auVar12,auVar132);
    auVar5 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar12 = vshufps_avx(auVar71,auVar71,0xc9);
    auVar4 = vshufps_avx(auVar6,auVar6,0xc9);
    fVar188 = auVar71._0_4_;
    auVar142._0_4_ = fVar188 * auVar4._0_4_;
    fVar203 = auVar71._4_4_;
    auVar142._4_4_ = fVar203 * auVar4._4_4_;
    fVar204 = auVar71._8_4_;
    auVar142._8_4_ = fVar204 * auVar4._8_4_;
    fVar205 = auVar71._12_4_;
    auVar142._12_4_ = fVar205 * auVar4._12_4_;
    auVar4 = vfmsub231ps_fma(auVar142,auVar12,auVar6);
    auVar6 = vshufps_avx(auVar4,auVar4,0xc9);
    auVar4 = vshufps_avx(auVar251,auVar251,0xc9);
    auVar174._0_4_ = fVar188 * auVar4._0_4_;
    auVar174._4_4_ = fVar203 * auVar4._4_4_;
    auVar174._8_4_ = fVar204 * auVar4._8_4_;
    auVar174._12_4_ = fVar205 * auVar4._12_4_;
    auVar4 = vfmsub231ps_fma(auVar174,auVar12,auVar251);
    auVar12 = vdpps_avx(auVar136,auVar136,0x7f);
    auVar251 = vshufps_avx(auVar4,auVar4,0xc9);
    fVar96 = auVar12._0_4_;
    auVar216._4_12_ = ZEXT812(0) << 0x20;
    auVar216._0_4_ = fVar96;
    auVar4 = vrsqrtss_avx(auVar216,auVar216);
    fVar68 = auVar4._0_4_;
    auVar4 = vdpps_avx(auVar136,auVar5,0x7f);
    fVar68 = fVar68 * 1.5 + fVar96 * -0.5 * fVar68 * fVar68 * fVar68;
    fVar152 = fVar68 * auVar136._0_4_;
    fVar171 = fVar68 * auVar136._4_4_;
    fVar172 = fVar68 * auVar136._8_4_;
    fVar173 = fVar68 * auVar136._12_4_;
    auVar228._0_4_ = auVar5._0_4_ * fVar96;
    auVar228._4_4_ = auVar5._4_4_ * fVar96;
    auVar228._8_4_ = auVar5._8_4_ * fVar96;
    auVar228._12_4_ = auVar5._12_4_ * fVar96;
    fVar96 = auVar4._0_4_;
    auVar190._0_4_ = fVar96 * auVar136._0_4_;
    auVar190._4_4_ = fVar96 * auVar136._4_4_;
    auVar190._8_4_ = fVar96 * auVar136._8_4_;
    auVar190._12_4_ = fVar96 * auVar136._12_4_;
    auVar136 = vsubps_avx(auVar228,auVar190);
    auVar4 = vrcpss_avx(auVar216,auVar216);
    auVar12 = vfnmadd213ss_fma(auVar12,auVar4,SUB6416(ZEXT464(0x40000000),0));
    fVar129 = auVar4._0_4_ * auVar12._0_4_;
    auVar12 = vdpps_avx(auVar6,auVar6,0x7f);
    fVar97 = auVar12._0_4_;
    auVar207._4_12_ = ZEXT812(0) << 0x20;
    auVar207._0_4_ = fVar97;
    auVar4 = vrsqrtss_avx(auVar207,auVar207);
    fVar96 = auVar4._0_4_;
    fVar96 = fVar96 * 1.5 + fVar97 * -0.5 * fVar96 * fVar96 * fVar96;
    fVar248 = fVar96 * auVar6._0_4_;
    fVar259 = fVar96 * auVar6._4_4_;
    fVar260 = fVar96 * auVar6._8_4_;
    fVar261 = fVar96 * auVar6._12_4_;
    auVar4 = vdpps_avx(auVar6,auVar251,0x7f);
    auVar175._0_4_ = fVar97 * auVar251._0_4_;
    auVar175._4_4_ = fVar97 * auVar251._4_4_;
    auVar175._8_4_ = fVar97 * auVar251._8_4_;
    auVar175._12_4_ = fVar97 * auVar251._12_4_;
    fVar97 = auVar4._0_4_;
    auVar143._0_4_ = fVar97 * auVar6._0_4_;
    auVar143._4_4_ = fVar97 * auVar6._4_4_;
    auVar143._8_4_ = fVar97 * auVar6._8_4_;
    auVar143._12_4_ = fVar97 * auVar6._12_4_;
    auVar5 = vsubps_avx(auVar175,auVar143);
    auVar4 = vrcpss_avx(auVar207,auVar207);
    auVar12 = vfnmadd213ss_fma(auVar12,auVar4,SUB6416(ZEXT464(0x40000000),0));
    fVar97 = auVar12._0_4_ * auVar4._0_4_;
    auVar12 = vshufps_avx(auVar135,auVar135,0xff);
    auVar208._0_4_ = auVar12._0_4_ * fVar152;
    auVar208._4_4_ = auVar12._4_4_ * fVar171;
    auVar208._8_4_ = auVar12._8_4_ * fVar172;
    auVar208._12_4_ = auVar12._12_4_ * fVar173;
    local_418 = vsubps_avx(auVar135,auVar208);
    auVar4 = vshufps_avx(auVar189,auVar189,0xff);
    auVar156._0_4_ = auVar4._0_4_ * fVar152 + auVar12._0_4_ * fVar68 * fVar129 * auVar136._0_4_;
    auVar156._4_4_ = auVar4._4_4_ * fVar171 + auVar12._4_4_ * fVar68 * fVar129 * auVar136._4_4_;
    auVar156._8_4_ = auVar4._8_4_ * fVar172 + auVar12._8_4_ * fVar68 * fVar129 * auVar136._8_4_;
    auVar156._12_4_ = auVar4._12_4_ * fVar173 + auVar12._12_4_ * fVar68 * fVar129 * auVar136._12_4_;
    auVar136 = vsubps_avx(auVar189,auVar156);
    local_428._0_4_ = auVar208._0_4_ + auVar135._0_4_;
    local_428._4_4_ = auVar208._4_4_ + auVar135._4_4_;
    fStack_420 = auVar208._8_4_ + auVar135._8_4_;
    fStack_41c = auVar208._12_4_ + auVar135._12_4_;
    auVar12 = vshufps_avx(auVar242,auVar242,0xff);
    auVar102._0_4_ = fVar248 * auVar12._0_4_;
    auVar102._4_4_ = fVar259 * auVar12._4_4_;
    auVar102._8_4_ = fVar260 * auVar12._8_4_;
    auVar102._12_4_ = fVar261 * auVar12._12_4_;
    local_438 = vsubps_avx(auVar242,auVar102);
    auVar4 = vshufps_avx(auVar71,auVar71,0xff);
    auVar73._0_4_ = fVar248 * auVar4._0_4_ + auVar12._0_4_ * fVar96 * auVar5._0_4_ * fVar97;
    auVar73._4_4_ = fVar259 * auVar4._4_4_ + auVar12._4_4_ * fVar96 * auVar5._4_4_ * fVar97;
    auVar73._8_4_ = fVar260 * auVar4._8_4_ + auVar12._8_4_ * fVar96 * auVar5._8_4_ * fVar97;
    auVar73._12_4_ = fVar261 * auVar4._12_4_ + auVar12._12_4_ * fVar96 * auVar5._12_4_ * fVar97;
    auVar12 = vsubps_avx(auVar71,auVar73);
    local_4a8 = auVar242._0_4_ + auVar102._0_4_;
    fStack_4a4 = auVar242._4_4_ + auVar102._4_4_;
    fStack_4a0 = auVar242._8_4_ + auVar102._8_4_;
    fStack_49c = auVar242._12_4_ + auVar102._12_4_;
    local_448._0_4_ = local_418._0_4_ + auVar136._0_4_ * 0.33333334;
    local_448._4_4_ = local_418._4_4_ + auVar136._4_4_ * 0.33333334;
    local_448._8_4_ = local_418._8_4_ + auVar136._8_4_ * 0.33333334;
    local_448._12_4_ = local_418._12_4_ + auVar136._12_4_ * 0.33333334;
    auVar74._0_4_ = auVar12._0_4_ * 0.33333334;
    auVar74._4_4_ = auVar12._4_4_ * 0.33333334;
    auVar74._8_4_ = auVar12._8_4_ * 0.33333334;
    auVar74._12_4_ = auVar12._12_4_ * 0.33333334;
    local_458 = vsubps_avx(local_438,auVar74);
    aVar2 = (ray->super_RayK<1>).org.field_0;
    auVar136 = vsubps_avx(local_418,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar136,auVar136,0x55);
    auVar4 = vshufps_avx(auVar136,auVar136,0xaa);
    aVar3 = (pre->ray_space).vy.field_0;
    fVar68 = (pre->ray_space).vz.field_0.m128[0];
    fVar96 = (pre->ray_space).vz.field_0.m128[1];
    fVar129 = (pre->ray_space).vz.field_0.m128[2];
    fVar97 = (pre->ray_space).vz.field_0.m128[3];
    auVar75._0_4_ = fVar68 * auVar4._0_4_;
    auVar75._4_4_ = fVar96 * auVar4._4_4_;
    auVar75._8_4_ = fVar129 * auVar4._8_4_;
    auVar75._12_4_ = fVar97 * auVar4._12_4_;
    auVar71 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar3,auVar12);
    auVar5 = vsubps_avx(local_448,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar5,auVar5,0x55);
    auVar4 = vshufps_avx(auVar5,auVar5,0xaa);
    auVar76._0_4_ = fVar68 * auVar4._0_4_;
    auVar76._4_4_ = fVar96 * auVar4._4_4_;
    auVar76._8_4_ = fVar129 * auVar4._8_4_;
    auVar76._12_4_ = fVar97 * auVar4._12_4_;
    auVar189 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar12);
    auVar4 = vsubps_avx(local_458,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar77._0_4_ = fVar68 * auVar12._0_4_;
    auVar77._4_4_ = fVar96 * auVar12._4_4_;
    auVar77._8_4_ = fVar129 * auVar12._8_4_;
    auVar77._12_4_ = fVar97 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar4,auVar4,0x55);
    auVar132 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar12);
    auVar6 = vsubps_avx(local_438,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar78._0_4_ = fVar68 * auVar12._0_4_;
    auVar78._4_4_ = fVar96 * auVar12._4_4_;
    auVar78._8_4_ = fVar129 * auVar12._8_4_;
    auVar78._12_4_ = fVar97 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar6,auVar6,0x55);
    auVar270 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar3,auVar12);
    auVar251 = vsubps_avx(_local_428,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar251,auVar251,0xaa);
    auVar157._0_4_ = fVar68 * auVar12._0_4_;
    auVar157._4_4_ = fVar96 * auVar12._4_4_;
    auVar157._8_4_ = fVar129 * auVar12._8_4_;
    auVar157._12_4_ = fVar97 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar251,auVar251,0x55);
    auVar72 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar3,auVar12);
    local_468._0_4_ = (fVar98 + auVar156._0_4_) * 0.33333334 + (float)local_428._0_4_;
    local_468._4_4_ = (fVar70 + auVar156._4_4_) * 0.33333334 + (float)local_428._4_4_;
    fStack_460 = (fVar153 + auVar156._8_4_) * 0.33333334 + fStack_420;
    fStack_45c = (fVar227 + auVar156._12_4_) * 0.33333334 + fStack_41c;
    auVar160 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar241._0_4_ = fVar68 * auVar12._0_4_;
    auVar241._4_4_ = fVar96 * auVar12._4_4_;
    auVar241._8_4_ = fVar129 * auVar12._8_4_;
    auVar241._12_4_ = fVar97 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar160,auVar160,0x55);
    auVar74 = vfmadd231ps_fma(auVar241,(undefined1  [16])aVar3,auVar12);
    auVar229._0_4_ = (fVar188 + auVar73._0_4_) * 0.33333334;
    auVar229._4_4_ = (fVar203 + auVar73._4_4_) * 0.33333334;
    auVar229._8_4_ = (fVar204 + auVar73._8_4_) * 0.33333334;
    auVar229._12_4_ = (fVar205 + auVar73._12_4_) * 0.33333334;
    auVar21._4_4_ = fStack_4a4;
    auVar21._0_4_ = local_4a8;
    auVar21._8_4_ = fStack_4a0;
    auVar21._12_4_ = fStack_49c;
    _local_478 = vsubps_avx(auVar21,auVar229);
    auVar135 = vsubps_avx(_local_478,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar135,auVar135,0xaa);
    auVar230._0_4_ = fVar68 * auVar12._0_4_;
    auVar230._4_4_ = fVar96 * auVar12._4_4_;
    auVar230._8_4_ = fVar129 * auVar12._8_4_;
    auVar230._12_4_ = fVar97 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar135,auVar135,0x55);
    auVar73 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar3,auVar12);
    auVar242 = vsubps_avx(auVar21,(undefined1  [16])aVar2);
    auVar12 = vshufps_avx(auVar242,auVar242,0xaa);
    auVar191._0_4_ = fVar68 * auVar12._0_4_;
    auVar191._4_4_ = fVar96 * auVar12._4_4_;
    auVar191._8_4_ = fVar129 * auVar12._8_4_;
    auVar191._12_4_ = fVar97 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar242,auVar242,0x55);
    auVar12 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar12);
    local_518._0_4_ = auVar136._0_4_;
    auVar176._4_4_ = local_518._0_4_;
    auVar176._0_4_ = local_518._0_4_;
    auVar176._8_4_ = local_518._0_4_;
    auVar176._12_4_ = local_518._0_4_;
    aVar3 = (pre->ray_space).vx.field_0;
    auVar71 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar3,auVar176);
    local_398._0_4_ = auVar5._0_4_;
    auVar177._4_4_ = local_398._0_4_;
    auVar177._0_4_ = local_398._0_4_;
    auVar177._8_4_ = local_398._0_4_;
    auVar177._12_4_ = local_398._0_4_;
    auVar5 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar3,auVar177);
    uVar69 = auVar4._0_4_;
    auVar178._4_4_ = uVar69;
    auVar178._0_4_ = uVar69;
    auVar178._8_4_ = uVar69;
    auVar178._12_4_ = uVar69;
    auVar189 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar3,auVar178);
    uVar69 = auVar6._0_4_;
    auVar179._4_4_ = uVar69;
    auVar179._0_4_ = uVar69;
    auVar179._8_4_ = uVar69;
    auVar179._12_4_ = uVar69;
    auVar6 = vfmadd231ps_fma(auVar270,(undefined1  [16])aVar3,auVar179);
    uVar69 = auVar251._0_4_;
    auVar180._4_4_ = uVar69;
    auVar180._0_4_ = uVar69;
    auVar180._8_4_ = uVar69;
    auVar180._12_4_ = uVar69;
    auVar251 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar180);
    uVar69 = auVar160._0_4_;
    auVar181._4_4_ = uVar69;
    auVar181._0_4_ = uVar69;
    auVar181._8_4_ = uVar69;
    auVar181._12_4_ = uVar69;
    auVar160 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar181);
    uVar69 = auVar135._0_4_;
    auVar79._4_4_ = uVar69;
    auVar79._0_4_ = uVar69;
    auVar79._8_4_ = uVar69;
    auVar79._12_4_ = uVar69;
    auVar135 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar79);
    uVar69 = auVar242._0_4_;
    auVar80._4_4_ = uVar69;
    auVar80._0_4_ = uVar69;
    auVar80._8_4_ = uVar69;
    auVar80._12_4_ = uVar69;
    auVar242 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar80);
    local_498 = vmovlhps_avx(auVar71,auVar251);
    local_518 = vmovlhps_avx(auVar5,auVar160);
    local_488 = vmovlhps_avx(auVar189,auVar135);
    _local_388 = vmovlhps_avx(auVar6,auVar242);
    auVar12 = vminps_avx(local_498,local_518);
    auVar4 = vminps_avx(local_488,_local_388);
    auVar136 = vminps_avx(auVar12,auVar4);
    auVar12 = vmaxps_avx(local_498,local_518);
    auVar4 = vmaxps_avx(local_488,_local_388);
    auVar12 = vmaxps_avx(auVar12,auVar4);
    auVar4 = vshufpd_avx(auVar136,auVar136,3);
    auVar136 = vminps_avx(auVar136,auVar4);
    auVar4 = vshufpd_avx(auVar12,auVar12,3);
    auVar4 = vmaxps_avx(auVar12,auVar4);
    auVar270._4_4_ = uStack_304;
    auVar270._0_4_ = local_308;
    auVar270._8_4_ = uStack_300;
    auVar270._12_4_ = uStack_2fc;
    auVar12 = vandps_avx(auVar270,auVar136);
    auVar4 = vandps_avx(auVar270,auVar4);
    auVar12 = vmaxps_avx(auVar12,auVar4);
    auVar4 = vmovshdup_avx(auVar12);
    auVar12 = vmaxss_avx(auVar4,auVar12);
    local_1d8 = auVar12._0_4_ * 9.536743e-07;
    local_3c8._8_8_ = auVar71._0_8_;
    local_3c8._0_8_ = auVar71._0_8_;
    auVar214 = ZEXT1664(local_3c8);
    local_3d8._8_8_ = auVar5._0_8_;
    local_3d8._0_8_ = auVar5._0_8_;
    local_3e8._8_8_ = auVar189._0_8_;
    local_3e8._0_8_ = auVar189._0_8_;
    local_3f8._8_8_ = auVar6._0_8_;
    local_3f8._0_8_ = auVar6._0_8_;
    register0x00001308 = auVar251._0_8_;
    local_408 = auVar251._0_8_;
    auVar151 = ZEXT1664(_local_408);
    local_4c8._8_8_ = auVar160._0_8_;
    local_4c8._0_8_ = auVar160._0_8_;
    auVar187 = ZEXT1664(local_4c8);
    local_4d8._0_8_ = auVar135._0_8_;
    local_4d8._8_8_ = local_4d8._0_8_;
    auVar239 = ZEXT1664(local_4d8);
    local_4e8._8_8_ = auVar242._0_8_;
    local_4e8._0_8_ = auVar242._0_8_;
    auVar247 = ZEXT1664(local_4e8);
    local_398 = ZEXT416((uint)local_1d8);
    fStack_1d4 = local_1d8;
    fStack_1d0 = local_1d8;
    fStack_1cc = local_1d8;
    fStack_1c8 = local_1d8;
    fStack_1c4 = local_1d8;
    fStack_1c0 = local_1d8;
    fStack_1bc = local_1d8;
    fStack_1f0 = -local_1d8;
    local_1f8 = -local_1d8;
    fStack_1f4 = -local_1d8;
    fStack_1ec = fStack_1f0;
    fStack_1e8 = fStack_1f0;
    fStack_1e4 = fStack_1f0;
    fStack_1e0 = fStack_1f0;
    fStack_1dc = fStack_1f0;
    uVar65 = 0;
    local_228 = vsubps_avx(local_518,local_498);
    local_238 = vsubps_avx(local_488,local_518);
    local_248 = vsubps_avx(_local_388,local_488);
    auVar226 = ZEXT1664(local_3f8);
    auVar202 = ZEXT1664(local_3e8);
    auVar170 = ZEXT1664(local_3d8);
    local_268 = vsubps_avx(_local_428,local_418);
    local_278 = vsubps_avx(_local_468,local_448);
    local_288 = vsubps_avx(_local_478,local_458);
    auVar132._4_4_ = fStack_4a4;
    auVar132._0_4_ = local_4a8;
    auVar132._8_4_ = fStack_4a0;
    auVar132._12_4_ = fStack_49c;
    _local_298 = vsubps_avx(auVar132,local_438);
    auVar258 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar269 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_017f8e0f:
    auVar72 = auVar258._0_16_;
    local_258 = auVar269._0_16_;
    auVar12 = vshufps_avx(auVar72,auVar72,0x50);
    auVar279._8_4_ = 0x3f800000;
    auVar279._0_8_ = 0x3f8000003f800000;
    auVar279._12_4_ = 0x3f800000;
    auVar284._16_4_ = 0x3f800000;
    auVar284._0_16_ = auVar279;
    auVar284._20_4_ = 0x3f800000;
    auVar284._24_4_ = 0x3f800000;
    auVar284._28_4_ = 0x3f800000;
    auVar4 = vsubps_avx(auVar279,auVar12);
    fVar68 = auVar12._0_4_;
    auVar81._0_4_ = auVar151._0_4_ * fVar68;
    fVar96 = auVar12._4_4_;
    auVar81._4_4_ = auVar151._4_4_ * fVar96;
    fVar129 = auVar12._8_4_;
    auVar81._8_4_ = auVar151._8_4_ * fVar129;
    fVar97 = auVar12._12_4_;
    auVar81._12_4_ = auVar151._12_4_ * fVar97;
    auVar182._0_4_ = auVar187._0_4_ * fVar68;
    auVar182._4_4_ = auVar187._4_4_ * fVar96;
    auVar182._8_4_ = auVar187._8_4_ * fVar129;
    auVar182._12_4_ = auVar187._12_4_ * fVar97;
    auVar144._0_4_ = auVar239._0_4_ * fVar68;
    auVar144._4_4_ = auVar239._4_4_ * fVar96;
    auVar144._8_4_ = auVar239._8_4_ * fVar129;
    auVar144._12_4_ = auVar239._12_4_ * fVar97;
    auVar118._0_4_ = auVar247._0_4_ * fVar68;
    auVar118._4_4_ = auVar247._4_4_ * fVar96;
    auVar118._8_4_ = auVar247._8_4_ * fVar129;
    auVar118._12_4_ = auVar247._12_4_ * fVar97;
    auVar6 = vfmadd231ps_fma(auVar81,auVar4,auVar214._0_16_);
    auVar251 = vfmadd231ps_fma(auVar182,auVar4,auVar170._0_16_);
    auVar160 = vfmadd231ps_fma(auVar144,auVar4,auVar202._0_16_);
    auVar135 = vfmadd231ps_fma(auVar118,auVar226._0_16_,auVar4);
    auVar12 = vmovshdup_avx(auVar269._0_16_);
    fVar68 = auVar269._0_4_;
    fStack_100 = (auVar12._0_4_ - fVar68) * 0.04761905;
    auVar225._4_4_ = fVar68;
    auVar225._0_4_ = fVar68;
    auVar225._8_4_ = fVar68;
    auVar225._12_4_ = fVar68;
    auVar225._16_4_ = fVar68;
    auVar225._20_4_ = fVar68;
    auVar225._24_4_ = fVar68;
    auVar225._28_4_ = fVar68;
    auVar113._0_8_ = auVar12._0_8_;
    auVar113._8_8_ = auVar113._0_8_;
    auVar113._16_8_ = auVar113._0_8_;
    auVar113._24_8_ = auVar113._0_8_;
    auVar92 = vsubps_avx(auVar113,auVar225);
    uVar69 = auVar6._0_4_;
    auVar276._4_4_ = uVar69;
    auVar276._0_4_ = uVar69;
    auVar276._8_4_ = uVar69;
    auVar276._12_4_ = uVar69;
    auVar276._16_4_ = uVar69;
    auVar276._20_4_ = uVar69;
    auVar276._24_4_ = uVar69;
    auVar276._28_4_ = uVar69;
    auVar12 = vmovshdup_avx(auVar6);
    uVar99 = auVar12._0_8_;
    auVar268._8_8_ = uVar99;
    auVar268._0_8_ = uVar99;
    auVar268._16_8_ = uVar99;
    auVar268._24_8_ = uVar99;
    fVar188 = auVar251._0_4_;
    auVar255._4_4_ = fVar188;
    auVar255._0_4_ = fVar188;
    auVar255._8_4_ = fVar188;
    auVar255._12_4_ = fVar188;
    auVar255._16_4_ = fVar188;
    auVar255._20_4_ = fVar188;
    auVar255._24_4_ = fVar188;
    auVar255._28_4_ = fVar188;
    auVar4 = vmovshdup_avx(auVar251);
    auVar114._0_8_ = auVar4._0_8_;
    auVar114._8_8_ = auVar114._0_8_;
    auVar114._16_8_ = auVar114._0_8_;
    auVar114._24_8_ = auVar114._0_8_;
    fVar227 = auVar160._0_4_;
    auVar199._4_4_ = fVar227;
    auVar199._0_4_ = fVar227;
    auVar199._8_4_ = fVar227;
    auVar199._12_4_ = fVar227;
    auVar199._16_4_ = fVar227;
    auVar199._20_4_ = fVar227;
    auVar199._24_4_ = fVar227;
    auVar199._28_4_ = fVar227;
    auVar136 = vmovshdup_avx(auVar160);
    auVar212._0_8_ = auVar136._0_8_;
    auVar212._8_8_ = auVar212._0_8_;
    auVar212._16_8_ = auVar212._0_8_;
    auVar212._24_8_ = auVar212._0_8_;
    fVar153 = auVar135._0_4_;
    auVar5 = vmovshdup_avx(auVar135);
    auVar242 = vfmadd132ps_fma(auVar92,auVar225,_DAT_01faff20);
    auVar92 = vsubps_avx(auVar284,ZEXT1632(auVar242));
    fVar68 = auVar242._0_4_;
    fVar96 = auVar242._4_4_;
    auVar13._4_4_ = fVar188 * fVar96;
    auVar13._0_4_ = fVar188 * fVar68;
    fVar129 = auVar242._8_4_;
    auVar13._8_4_ = fVar188 * fVar129;
    fVar97 = auVar242._12_4_;
    auVar13._12_4_ = fVar188 * fVar97;
    auVar13._16_4_ = fVar188 * 0.0;
    auVar13._20_4_ = fVar188 * 0.0;
    auVar13._24_4_ = fVar188 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar242 = vfmadd231ps_fma(auVar13,auVar92,auVar276);
    fVar98 = auVar4._0_4_;
    fVar70 = auVar4._4_4_;
    auVar24._4_4_ = fVar70 * fVar96;
    auVar24._0_4_ = fVar98 * fVar68;
    auVar24._8_4_ = fVar98 * fVar129;
    auVar24._12_4_ = fVar70 * fVar97;
    auVar24._16_4_ = fVar98 * 0.0;
    auVar24._20_4_ = fVar70 * 0.0;
    auVar24._24_4_ = fVar98 * 0.0;
    auVar24._28_4_ = uVar69;
    auVar71 = vfmadd231ps_fma(auVar24,auVar92,auVar268);
    auVar25._4_4_ = fVar227 * fVar96;
    auVar25._0_4_ = fVar227 * fVar68;
    auVar25._8_4_ = fVar227 * fVar129;
    auVar25._12_4_ = fVar227 * fVar97;
    auVar25._16_4_ = fVar227 * 0.0;
    auVar25._20_4_ = fVar227 * 0.0;
    auVar25._24_4_ = fVar227 * 0.0;
    auVar25._28_4_ = auVar12._4_4_;
    auVar189 = vfmadd231ps_fma(auVar25,auVar92,auVar255);
    fVar98 = auVar136._0_4_;
    fVar70 = auVar136._4_4_;
    auVar26._4_4_ = fVar70 * fVar96;
    auVar26._0_4_ = fVar98 * fVar68;
    auVar26._8_4_ = fVar98 * fVar129;
    auVar26._12_4_ = fVar70 * fVar97;
    auVar26._16_4_ = fVar98 * 0.0;
    auVar26._20_4_ = fVar70 * 0.0;
    auVar26._24_4_ = fVar98 * 0.0;
    auVar26._28_4_ = fVar188;
    auVar132 = vfmadd231ps_fma(auVar26,auVar92,auVar114);
    auVar12 = vshufps_avx(auVar6,auVar6,0xaa);
    local_3b8._8_8_ = auVar12._0_8_;
    local_3b8._0_8_ = local_3b8._8_8_;
    local_3b8._16_8_ = local_3b8._8_8_;
    local_3b8._24_8_ = local_3b8._8_8_;
    auVar4 = vshufps_avx(auVar6,auVar6,0xff);
    uStack_500 = auVar4._0_8_;
    local_508 = (undefined1  [8])uStack_500;
    uStack_4f8 = uStack_500;
    uStack_4f0 = uStack_500;
    auVar27._4_4_ = fVar153 * fVar96;
    auVar27._0_4_ = fVar153 * fVar68;
    auVar27._8_4_ = fVar153 * fVar129;
    auVar27._12_4_ = fVar153 * fVar97;
    auVar27._16_4_ = fVar153 * 0.0;
    auVar27._20_4_ = fVar153 * 0.0;
    auVar27._24_4_ = fVar153 * 0.0;
    auVar27._28_4_ = fVar153;
    auVar6 = vfmadd231ps_fma(auVar27,auVar92,auVar199);
    auVar4 = vshufps_avx(auVar251,auVar251,0xaa);
    auVar200._0_8_ = auVar4._0_8_;
    auVar200._8_8_ = auVar200._0_8_;
    auVar200._16_8_ = auVar200._0_8_;
    auVar200._24_8_ = auVar200._0_8_;
    auVar136 = vshufps_avx(auVar251,auVar251,0xff);
    local_328._8_8_ = auVar136._0_8_;
    local_328._0_8_ = local_328._8_8_;
    local_328._16_8_ = local_328._8_8_;
    local_328._24_8_ = local_328._8_8_;
    fVar98 = auVar5._0_4_;
    fVar70 = auVar5._4_4_;
    auVar28._4_4_ = fVar70 * fVar96;
    auVar28._0_4_ = fVar98 * fVar68;
    auVar28._8_4_ = fVar98 * fVar129;
    auVar28._12_4_ = fVar70 * fVar97;
    auVar28._16_4_ = fVar98 * 0.0;
    auVar28._20_4_ = fVar70 * 0.0;
    auVar28._24_4_ = fVar98 * 0.0;
    auVar28._28_4_ = auVar12._4_4_;
    auVar270 = vfmadd231ps_fma(auVar28,auVar92,auVar212);
    auVar29._28_4_ = fVar70;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar189._12_4_ * fVar97,
                            CONCAT48(auVar189._8_4_ * fVar129,
                                     CONCAT44(auVar189._4_4_ * fVar96,auVar189._0_4_ * fVar68))));
    auVar242 = vfmadd231ps_fma(auVar29,auVar92,ZEXT1632(auVar242));
    fVar98 = auVar136._4_4_;
    auVar30._28_4_ = fVar98;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar132._12_4_ * fVar97,
                            CONCAT48(auVar132._8_4_ * fVar129,
                                     CONCAT44(auVar132._4_4_ * fVar96,auVar132._0_4_ * fVar68))));
    auVar71 = vfmadd231ps_fma(auVar30,auVar92,ZEXT1632(auVar71));
    auVar12 = vshufps_avx(auVar160,auVar160,0xaa);
    uVar99 = auVar12._0_8_;
    auVar186._8_8_ = uVar99;
    auVar186._0_8_ = uVar99;
    auVar186._16_8_ = uVar99;
    auVar186._24_8_ = uVar99;
    auVar5 = vshufps_avx(auVar160,auVar160,0xff);
    uVar99 = auVar5._0_8_;
    auVar285._8_8_ = uVar99;
    auVar285._0_8_ = uVar99;
    auVar285._16_8_ = uVar99;
    auVar285._24_8_ = uVar99;
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar97,
                                                  CONCAT48(auVar6._8_4_ * fVar129,
                                                           CONCAT44(auVar6._4_4_ * fVar96,
                                                                    auVar6._0_4_ * fVar68)))),
                               auVar92,ZEXT1632(auVar189));
    auVar6 = vshufps_avx(auVar135,auVar135,0xaa);
    auVar251 = vshufps_avx(auVar135,auVar135,0xff);
    auVar135 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar97 * auVar270._12_4_,
                                                  CONCAT48(fVar129 * auVar270._8_4_,
                                                           CONCAT44(fVar96 * auVar270._4_4_,
                                                                    fVar68 * auVar270._0_4_)))),
                               auVar92,ZEXT1632(auVar132));
    auVar189 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar97 * auVar160._12_4_,
                                                  CONCAT48(fVar129 * auVar160._8_4_,
                                                           CONCAT44(fVar96 * auVar160._4_4_,
                                                                    fVar68 * auVar160._0_4_)))),
                               auVar92,ZEXT1632(auVar242));
    auVar13 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar242));
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar97 * auVar135._12_4_,
                                                  CONCAT48(fVar129 * auVar135._8_4_,
                                                           CONCAT44(fVar96 * auVar135._4_4_,
                                                                    fVar68 * auVar135._0_4_)))),
                               auVar92,ZEXT1632(auVar71));
    auVar14 = vsubps_avx(ZEXT1632(auVar135),ZEXT1632(auVar71));
    fStack_2dc = auVar14._28_4_;
    auVar256._0_4_ = fStack_100 * auVar13._0_4_ * 3.0;
    auVar256._4_4_ = fStack_100 * auVar13._4_4_ * 3.0;
    auVar256._8_4_ = fStack_100 * auVar13._8_4_ * 3.0;
    auVar256._12_4_ = fStack_100 * auVar13._12_4_ * 3.0;
    auVar256._16_4_ = fStack_100 * auVar13._16_4_ * 3.0;
    auVar256._20_4_ = fStack_100 * auVar13._20_4_ * 3.0;
    auVar256._24_4_ = fStack_100 * auVar13._24_4_ * 3.0;
    auVar256._28_4_ = 0;
    local_2f8._0_4_ = fStack_100 * auVar14._0_4_ * 3.0;
    local_2f8._4_4_ = fStack_100 * auVar14._4_4_ * 3.0;
    fStack_2f0 = fStack_100 * auVar14._8_4_ * 3.0;
    fStack_2ec = fStack_100 * auVar14._12_4_ * 3.0;
    fStack_2e8 = fStack_100 * auVar14._16_4_ * 3.0;
    fStack_2e4 = fStack_100 * auVar14._20_4_ * 3.0;
    fStack_2e0 = fStack_100 * auVar14._24_4_ * 3.0;
    fVar70 = auVar4._0_4_;
    fVar153 = auVar4._4_4_;
    auVar31._4_4_ = fVar153 * fVar96;
    auVar31._0_4_ = fVar70 * fVar68;
    auVar31._8_4_ = fVar70 * fVar129;
    auVar31._12_4_ = fVar153 * fVar97;
    auVar31._16_4_ = fVar70 * 0.0;
    auVar31._20_4_ = fVar153 * 0.0;
    auVar31._24_4_ = fVar70 * 0.0;
    auVar31._28_4_ = fStack_2dc;
    auVar4 = vfmadd231ps_fma(auVar31,auVar92,local_3b8);
    fVar70 = auVar136._0_4_;
    auVar32._4_4_ = fVar98 * fVar96;
    auVar32._0_4_ = fVar70 * fVar68;
    auVar32._8_4_ = fVar70 * fVar129;
    auVar32._12_4_ = fVar98 * fVar97;
    auVar32._16_4_ = fVar70 * 0.0;
    auVar32._20_4_ = fVar98 * 0.0;
    auVar32._24_4_ = fVar70 * 0.0;
    auVar32._28_4_ = 0;
    auVar136 = vfmadd231ps_fma(auVar32,auVar92,_local_508);
    fVar98 = auVar12._0_4_;
    fVar70 = auVar12._4_4_;
    auVar33._4_4_ = fVar70 * fVar96;
    auVar33._0_4_ = fVar98 * fVar68;
    auVar33._8_4_ = fVar98 * fVar129;
    auVar33._12_4_ = fVar70 * fVar97;
    auVar33._16_4_ = fVar98 * 0.0;
    auVar33._20_4_ = fVar70 * 0.0;
    auVar33._24_4_ = fVar98 * 0.0;
    auVar33._28_4_ = auVar13._28_4_;
    auVar12 = vfmadd231ps_fma(auVar33,auVar92,auVar200);
    fVar98 = auVar5._0_4_;
    fVar227 = auVar5._4_4_;
    auVar34._4_4_ = fVar227 * fVar96;
    auVar34._0_4_ = fVar98 * fVar68;
    auVar34._8_4_ = fVar98 * fVar129;
    auVar34._12_4_ = fVar227 * fVar97;
    auVar34._16_4_ = fVar98 * 0.0;
    auVar34._20_4_ = fVar227 * 0.0;
    auVar34._24_4_ = fVar98 * 0.0;
    auVar34._28_4_ = fVar153;
    auVar5 = vfmadd231ps_fma(auVar34,auVar92,local_328);
    local_328 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar189));
    fVar98 = auVar6._0_4_;
    fVar70 = auVar6._4_4_;
    auVar35._4_4_ = fVar70 * fVar96;
    auVar35._0_4_ = fVar98 * fVar68;
    auVar35._8_4_ = fVar98 * fVar129;
    auVar35._12_4_ = fVar70 * fVar97;
    auVar35._16_4_ = fVar98 * 0.0;
    auVar35._20_4_ = fVar70 * 0.0;
    auVar35._24_4_ = fVar98 * 0.0;
    auVar35._28_4_ = fVar70;
    auVar6 = vfmadd231ps_fma(auVar35,auVar92,auVar186);
    _local_508 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar160));
    auVar18 = _local_508;
    fVar98 = auVar251._0_4_;
    fVar70 = auVar251._4_4_;
    auVar36._4_4_ = fVar70 * fVar96;
    auVar36._0_4_ = fVar98 * fVar68;
    auVar36._8_4_ = fVar98 * fVar129;
    auVar36._12_4_ = fVar70 * fVar97;
    auVar36._16_4_ = fVar98 * 0.0;
    auVar36._20_4_ = fVar70 * 0.0;
    auVar36._24_4_ = fVar98 * 0.0;
    auVar36._28_4_ = fVar70;
    auVar251 = vfmadd231ps_fma(auVar36,auVar92,auVar285);
    auVar37._28_4_ = fVar227;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(auVar12._12_4_ * fVar97,
                            CONCAT48(auVar12._8_4_ * fVar129,
                                     CONCAT44(auVar12._4_4_ * fVar96,auVar12._0_4_ * fVar68))));
    auVar4 = vfmadd231ps_fma(auVar37,auVar92,ZEXT1632(auVar4));
    auVar136 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar97 * auVar5._12_4_,
                                                  CONCAT48(fVar129 * auVar5._8_4_,
                                                           CONCAT44(fVar96 * auVar5._4_4_,
                                                                    fVar68 * auVar5._0_4_)))),
                               auVar92,ZEXT1632(auVar136));
    local_3b8._0_4_ = auVar189._0_4_ + auVar256._0_4_;
    local_3b8._4_4_ = auVar189._4_4_ + auVar256._4_4_;
    local_3b8._8_4_ = auVar189._8_4_ + auVar256._8_4_;
    local_3b8._12_4_ = auVar189._12_4_ + auVar256._12_4_;
    local_3b8._16_4_ = auVar256._16_4_ + 0.0;
    local_3b8._20_4_ = auVar256._20_4_ + 0.0;
    local_3b8._24_4_ = auVar256._24_4_ + 0.0;
    local_3b8._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar97,
                                                 CONCAT48(auVar6._8_4_ * fVar129,
                                                          CONCAT44(auVar6._4_4_ * fVar96,
                                                                   auVar6._0_4_ * fVar68)))),auVar92
                              ,ZEXT1632(auVar12));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar251._12_4_ * fVar97,
                                                CONCAT48(auVar251._8_4_ * fVar129,
                                                         CONCAT44(auVar251._4_4_ * fVar96,
                                                                  auVar251._0_4_ * fVar68)))),
                             auVar92,ZEXT1632(auVar5));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar97 * auVar12._12_4_,
                                                CONCAT48(fVar129 * auVar12._8_4_,
                                                         CONCAT44(fVar96 * auVar12._4_4_,
                                                                  fVar68 * auVar12._0_4_)))),auVar92
                             ,ZEXT1632(auVar4));
    auVar251 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar97,
                                                  CONCAT48(auVar5._8_4_ * fVar129,
                                                           CONCAT44(auVar5._4_4_ * fVar96,
                                                                    auVar5._0_4_ * fVar68)))),
                               ZEXT1632(auVar136),auVar92);
    auVar92 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar4));
    auVar13 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar136));
    auVar277._0_4_ = fStack_100 * auVar92._0_4_ * 3.0;
    auVar277._4_4_ = fStack_100 * auVar92._4_4_ * 3.0;
    auVar277._8_4_ = fStack_100 * auVar92._8_4_ * 3.0;
    auVar277._12_4_ = fStack_100 * auVar92._12_4_ * 3.0;
    auVar277._16_4_ = fStack_100 * auVar92._16_4_ * 3.0;
    auVar277._20_4_ = fStack_100 * auVar92._20_4_ * 3.0;
    auVar277._24_4_ = fStack_100 * auVar92._24_4_ * 3.0;
    auVar277._28_4_ = 0;
    local_118 = fStack_100 * auVar13._0_4_ * 3.0;
    fStack_114 = fStack_100 * auVar13._4_4_ * 3.0;
    auVar38._4_4_ = fStack_114;
    auVar38._0_4_ = local_118;
    fStack_110 = fStack_100 * auVar13._8_4_ * 3.0;
    auVar38._8_4_ = fStack_110;
    fStack_10c = fStack_100 * auVar13._12_4_ * 3.0;
    auVar38._12_4_ = fStack_10c;
    fStack_108 = fStack_100 * auVar13._16_4_ * 3.0;
    auVar38._16_4_ = fStack_108;
    fStack_104 = fStack_100 * auVar13._20_4_ * 3.0;
    auVar38._20_4_ = fStack_104;
    fStack_100 = fStack_100 * auVar13._24_4_ * 3.0;
    auVar38._24_4_ = fStack_100;
    auVar38._28_4_ = 0x40400000;
    _local_348 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar6));
    local_218 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar251));
    auVar92 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar189));
    auVar13 = vsubps_avx(ZEXT1632(auVar251),ZEXT1632(auVar160));
    auVar14 = vsubps_avx(_local_348,local_328);
    fVar188 = auVar92._0_4_ + auVar14._0_4_;
    fVar203 = auVar92._4_4_ + auVar14._4_4_;
    fVar204 = auVar92._8_4_ + auVar14._8_4_;
    fVar205 = auVar92._12_4_ + auVar14._12_4_;
    fVar152 = auVar92._16_4_ + auVar14._16_4_;
    fVar171 = auVar92._20_4_ + auVar14._20_4_;
    fVar172 = auVar92._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_218,_local_508);
    auVar93._0_4_ = auVar13._0_4_ + auVar15._0_4_;
    auVar93._4_4_ = auVar13._4_4_ + auVar15._4_4_;
    auVar93._8_4_ = auVar13._8_4_ + auVar15._8_4_;
    auVar93._12_4_ = auVar13._12_4_ + auVar15._12_4_;
    auVar93._16_4_ = auVar13._16_4_ + auVar15._16_4_;
    auVar93._20_4_ = auVar13._20_4_ + auVar15._20_4_;
    auVar93._24_4_ = auVar13._24_4_ + auVar15._24_4_;
    auVar93._28_4_ = auVar13._28_4_ + auVar15._28_4_;
    local_b8 = ZEXT1632(auVar160);
    fVar68 = auVar160._0_4_;
    local_138 = (float)local_2f8._0_4_ + fVar68;
    fVar96 = auVar160._4_4_;
    fStack_134 = (float)local_2f8._4_4_ + fVar96;
    fVar129 = auVar160._8_4_;
    fStack_130 = fStack_2f0 + fVar129;
    fVar97 = auVar160._12_4_;
    fStack_12c = fStack_2ec + fVar97;
    fStack_128 = fStack_2e8 + 0.0;
    fStack_124 = fStack_2e4 + 0.0;
    fStack_120 = fStack_2e0 + 0.0;
    local_78 = ZEXT1632(auVar189);
    auVar13 = vsubps_avx(local_78,auVar256);
    local_98 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar13 = vsubps_avx(local_b8,_local_2f8);
    local_158 = vpermps_avx2(_DAT_01fec480,auVar13);
    local_d8._0_4_ = auVar6._0_4_ + auVar277._0_4_;
    local_d8._4_4_ = auVar6._4_4_ + auVar277._4_4_;
    local_d8._8_4_ = auVar6._8_4_ + auVar277._8_4_;
    local_d8._12_4_ = auVar6._12_4_ + auVar277._12_4_;
    local_d8._16_4_ = auVar277._16_4_ + 0.0;
    local_d8._20_4_ = auVar277._20_4_ + 0.0;
    local_d8._24_4_ = auVar277._24_4_ + 0.0;
    local_d8._28_4_ = 0;
    auVar151 = ZEXT3264(local_d8);
    auVar257 = ZEXT1632(auVar6);
    auVar13 = vsubps_avx(auVar257,auVar277);
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar13);
    fVar98 = auVar251._0_4_;
    local_118 = fVar98 + local_118;
    fVar70 = auVar251._4_4_;
    fStack_114 = fVar70 + fStack_114;
    fVar153 = auVar251._8_4_;
    fStack_110 = fVar153 + fStack_110;
    fVar227 = auVar251._12_4_;
    fStack_10c = fVar227 + fStack_10c;
    fStack_108 = fStack_108 + 0.0;
    fStack_104 = fStack_104 + 0.0;
    fStack_100 = fStack_100 + 0.0;
    auVar13 = vsubps_avx(ZEXT1632(auVar251),auVar38);
    local_f8 = vpermps_avx2(_DAT_01fec480,auVar13);
    auVar39._4_4_ = fVar96 * fVar203;
    auVar39._0_4_ = fVar68 * fVar188;
    auVar39._8_4_ = fVar129 * fVar204;
    auVar39._12_4_ = fVar97 * fVar205;
    auVar39._16_4_ = fVar152 * 0.0;
    auVar39._20_4_ = fVar171 * 0.0;
    auVar39._24_4_ = fVar172 * 0.0;
    auVar39._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar39,local_78,auVar93);
    fStack_11c = fStack_2dc + 0.0;
    auVar40._4_4_ = fStack_134 * fVar203;
    auVar40._0_4_ = local_138 * fVar188;
    auVar40._8_4_ = fStack_130 * fVar204;
    auVar40._12_4_ = fStack_12c * fVar205;
    auVar40._16_4_ = fStack_128 * fVar152;
    auVar40._20_4_ = fStack_124 * fVar171;
    auVar40._24_4_ = fStack_120 * fVar172;
    auVar40._28_4_ = 0;
    auVar4 = vfnmadd231ps_fma(auVar40,auVar93,local_3b8);
    auVar41._4_4_ = local_158._4_4_ * fVar203;
    auVar41._0_4_ = local_158._0_4_ * fVar188;
    auVar41._8_4_ = local_158._8_4_ * fVar204;
    auVar41._12_4_ = local_158._12_4_ * fVar205;
    auVar41._16_4_ = local_158._16_4_ * fVar152;
    auVar41._20_4_ = local_158._20_4_ * fVar171;
    auVar41._24_4_ = local_158._24_4_ * fVar172;
    auVar41._28_4_ = fStack_2dc + 0.0;
    auVar136 = vfnmadd231ps_fma(auVar41,local_98,auVar93);
    auVar42._4_4_ = (float)local_508._4_4_ * fVar203;
    auVar42._0_4_ = (float)local_508._0_4_ * fVar188;
    auVar42._8_4_ = (float)uStack_500 * fVar204;
    auVar42._12_4_ = uStack_500._4_4_ * fVar205;
    auVar42._16_4_ = (float)uStack_4f8 * fVar152;
    auVar42._20_4_ = uStack_4f8._4_4_ * fVar171;
    auVar42._24_4_ = (float)uStack_4f0 * fVar172;
    auVar42._28_4_ = uStack_4f0._4_4_;
    auVar5 = vfnmadd231ps_fma(auVar42,local_328,auVar93);
    auVar213._0_4_ = fVar98 * fVar188;
    auVar213._4_4_ = fVar70 * fVar203;
    auVar213._8_4_ = fVar153 * fVar204;
    auVar213._12_4_ = fVar227 * fVar205;
    auVar213._16_4_ = fVar152 * 0.0;
    auVar213._20_4_ = fVar171 * 0.0;
    auVar213._24_4_ = fVar172 * 0.0;
    auVar213._28_4_ = 0;
    auVar6 = vfnmadd231ps_fma(auVar213,auVar257,auVar93);
    uStack_fc = 0x40400000;
    auVar43._4_4_ = fStack_114 * fVar203;
    auVar43._0_4_ = local_118 * fVar188;
    auVar43._8_4_ = fStack_110 * fVar204;
    auVar43._12_4_ = fStack_10c * fVar205;
    auVar43._16_4_ = fStack_108 * fVar152;
    auVar43._20_4_ = fStack_104 * fVar171;
    auVar43._24_4_ = fStack_100 * fVar172;
    auVar43._28_4_ = local_328._28_4_;
    auVar160 = vfnmadd231ps_fma(auVar43,local_d8,auVar93);
    auVar44._4_4_ = local_f8._4_4_ * fVar203;
    auVar44._0_4_ = local_f8._0_4_ * fVar188;
    auVar44._8_4_ = local_f8._8_4_ * fVar204;
    auVar44._12_4_ = local_f8._12_4_ * fVar205;
    auVar44._16_4_ = local_f8._16_4_ * fVar152;
    auVar44._20_4_ = local_f8._20_4_ * fVar171;
    auVar44._24_4_ = local_f8._24_4_ * fVar172;
    auVar44._28_4_ = local_f8._28_4_;
    _local_2f8 = auVar17;
    auVar135 = vfnmadd231ps_fma(auVar44,auVar17,auVar93);
    auVar45._4_4_ = local_218._4_4_ * fVar203;
    auVar45._0_4_ = local_218._0_4_ * fVar188;
    auVar45._8_4_ = local_218._8_4_ * fVar204;
    auVar45._12_4_ = local_218._12_4_ * fVar205;
    auVar45._16_4_ = local_218._16_4_ * fVar152;
    auVar45._20_4_ = local_218._20_4_ * fVar171;
    auVar45._24_4_ = local_218._24_4_ * fVar172;
    auVar45._28_4_ = auVar92._28_4_ + auVar14._28_4_;
    auVar242 = vfnmadd231ps_fma(auVar45,_local_348,auVar93);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar4));
    auVar92 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar4));
    auVar14 = vminps_avx(ZEXT1632(auVar136),ZEXT1632(auVar5));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar136),ZEXT1632(auVar5));
    auVar92 = vmaxps_avx(auVar92,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar160));
    auVar13 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar160));
    auVar16 = vminps_avx(ZEXT1632(auVar135),ZEXT1632(auVar242));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar135),ZEXT1632(auVar242));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar92,auVar13);
    auVar57._4_4_ = fStack_1d4;
    auVar57._0_4_ = local_1d8;
    auVar57._8_4_ = fStack_1d0;
    auVar57._12_4_ = fStack_1cc;
    auVar57._16_4_ = fStack_1c8;
    auVar57._20_4_ = fStack_1c4;
    auVar57._24_4_ = fStack_1c0;
    auVar57._28_4_ = fStack_1bc;
    auVar92 = vcmpps_avx(auVar15,auVar57,2);
    auVar55._4_4_ = fStack_1f4;
    auVar55._0_4_ = local_1f8;
    auVar55._8_4_ = fStack_1f0;
    auVar55._12_4_ = fStack_1ec;
    auVar55._16_4_ = fStack_1e8;
    auVar55._20_4_ = fStack_1e4;
    auVar55._24_4_ = fStack_1e0;
    auVar55._28_4_ = fStack_1dc;
    auVar13 = vcmpps_avx(auVar13,auVar55,5);
    auVar92 = vandps_avx(auVar13,auVar92);
    auVar13 = local_178 & auVar92;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_328,local_78);
      auVar14 = vsubps_avx(_local_348,auVar257);
      fVar203 = auVar13._0_4_ + auVar14._0_4_;
      fVar204 = auVar13._4_4_ + auVar14._4_4_;
      fVar205 = auVar13._8_4_ + auVar14._8_4_;
      fVar152 = auVar13._12_4_ + auVar14._12_4_;
      fVar171 = auVar13._16_4_ + auVar14._16_4_;
      fVar172 = auVar13._20_4_ + auVar14._20_4_;
      fVar173 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_508,local_b8);
      auVar16 = vsubps_avx(local_218,ZEXT1632(auVar251));
      auVar115._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar115._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar115._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar115._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar115._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar115._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar115._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar188 = auVar16._28_4_;
      auVar115._28_4_ = auVar15._28_4_ + fVar188;
      auVar46._4_4_ = fVar96 * fVar204;
      auVar46._0_4_ = fVar68 * fVar203;
      auVar46._8_4_ = fVar129 * fVar205;
      auVar46._12_4_ = fVar97 * fVar152;
      auVar46._16_4_ = fVar171 * 0.0;
      auVar46._20_4_ = fVar172 * 0.0;
      auVar46._24_4_ = fVar173 * 0.0;
      auVar46._28_4_ = local_348._28_4_;
      auVar6 = vfnmadd231ps_fma(auVar46,auVar115,local_78);
      auVar47._4_4_ = fVar204 * fStack_134;
      auVar47._0_4_ = fVar203 * local_138;
      auVar47._8_4_ = fVar205 * fStack_130;
      auVar47._12_4_ = fVar152 * fStack_12c;
      auVar47._16_4_ = fVar171 * fStack_128;
      auVar47._20_4_ = fVar172 * fStack_124;
      auVar47._24_4_ = fVar173 * fStack_120;
      auVar47._28_4_ = 0;
      auVar12 = vfnmadd213ps_fma(local_3b8,auVar115,auVar47);
      auVar48._4_4_ = fVar204 * local_158._4_4_;
      auVar48._0_4_ = fVar203 * local_158._0_4_;
      auVar48._8_4_ = fVar205 * local_158._8_4_;
      auVar48._12_4_ = fVar152 * local_158._12_4_;
      auVar48._16_4_ = fVar171 * local_158._16_4_;
      auVar48._20_4_ = fVar172 * local_158._20_4_;
      auVar48._24_4_ = fVar173 * local_158._24_4_;
      auVar48._28_4_ = 0;
      auVar4 = vfnmadd213ps_fma(local_98,auVar115,auVar48);
      auVar49._4_4_ = (float)local_508._4_4_ * fVar204;
      auVar49._0_4_ = (float)local_508._0_4_ * fVar203;
      auVar49._8_4_ = (float)uStack_500 * fVar205;
      auVar49._12_4_ = uStack_500._4_4_ * fVar152;
      auVar49._16_4_ = (float)uStack_4f8 * fVar171;
      auVar49._20_4_ = uStack_4f8._4_4_ * fVar172;
      auVar49._24_4_ = (float)uStack_4f0 * fVar173;
      auVar49._28_4_ = 0;
      auVar251 = vfnmadd231ps_fma(auVar49,auVar115,local_328);
      auVar140._0_4_ = fVar98 * fVar203;
      auVar140._4_4_ = fVar70 * fVar204;
      auVar140._8_4_ = fVar153 * fVar205;
      auVar140._12_4_ = fVar227 * fVar152;
      auVar140._16_4_ = fVar171 * 0.0;
      auVar140._20_4_ = fVar172 * 0.0;
      auVar140._24_4_ = fVar173 * 0.0;
      auVar140._28_4_ = 0;
      auVar160 = vfnmadd231ps_fma(auVar140,auVar115,auVar257);
      auVar50._4_4_ = fVar204 * fStack_114;
      auVar50._0_4_ = fVar203 * local_118;
      auVar50._8_4_ = fVar205 * fStack_110;
      auVar50._12_4_ = fVar152 * fStack_10c;
      auVar50._16_4_ = fVar171 * fStack_108;
      auVar50._20_4_ = fVar172 * fStack_104;
      auVar50._24_4_ = fVar173 * fStack_100;
      auVar50._28_4_ = fVar188;
      auVar136 = vfnmadd213ps_fma(local_d8,auVar115,auVar50);
      auVar51._4_4_ = fVar204 * local_f8._4_4_;
      auVar51._0_4_ = fVar203 * local_f8._0_4_;
      auVar51._8_4_ = fVar205 * local_f8._8_4_;
      auVar51._12_4_ = fVar152 * local_f8._12_4_;
      auVar51._16_4_ = fVar171 * local_f8._16_4_;
      auVar51._20_4_ = fVar172 * local_f8._20_4_;
      auVar51._24_4_ = fVar173 * local_f8._24_4_;
      auVar51._28_4_ = fVar188;
      auVar5 = vfnmadd213ps_fma(auVar17,auVar115,auVar51);
      auVar151 = ZEXT1664(auVar5);
      auVar52._4_4_ = local_218._4_4_ * fVar204;
      auVar52._0_4_ = local_218._0_4_ * fVar203;
      auVar52._8_4_ = local_218._8_4_ * fVar205;
      auVar52._12_4_ = local_218._12_4_ * fVar152;
      auVar52._16_4_ = local_218._16_4_ * fVar171;
      auVar52._20_4_ = local_218._20_4_ * fVar172;
      auVar52._24_4_ = local_218._24_4_ * fVar173;
      auVar52._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar135 = vfnmadd231ps_fma(auVar52,auVar115,_local_348);
      auVar14 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar251));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar251));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar160),ZEXT1632(auVar136));
      auVar14 = vmaxps_avx(ZEXT1632(auVar160),ZEXT1632(auVar136));
      auVar17 = vminps_avx(ZEXT1632(auVar5),ZEXT1632(auVar135));
      auVar16 = vminps_avx(auVar16,auVar17);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar135));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar58._4_4_ = fStack_1d4;
      auVar58._0_4_ = local_1d8;
      auVar58._8_4_ = fStack_1d0;
      auVar58._12_4_ = fStack_1cc;
      auVar58._16_4_ = fStack_1c8;
      auVar58._20_4_ = fStack_1c4;
      auVar58._24_4_ = fStack_1c0;
      auVar58._28_4_ = fStack_1bc;
      auVar13 = vcmpps_avx(auVar16,auVar58,2);
      auVar56._4_4_ = fStack_1f4;
      auVar56._0_4_ = local_1f8;
      auVar56._8_4_ = fStack_1f0;
      auVar56._12_4_ = fStack_1ec;
      auVar56._16_4_ = fStack_1e8;
      auVar56._20_4_ = fStack_1e4;
      auVar56._24_4_ = fStack_1e0;
      auVar56._28_4_ = fStack_1dc;
      auVar14 = vcmpps_avx(auVar14,auVar56,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar92 = vandps_avx(auVar92,local_178);
      auVar14 = auVar92 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar13,auVar92);
        uVar64 = vmovmskps_avx(auVar92);
        if (uVar64 != 0) {
          uVar67 = (ulong)uVar65;
          auStack_2d8[uVar67] = uVar64 & 0xff;
          uVar99 = vmovlps_avx(local_258);
          *(undefined8 *)(&uStack_1b8 + uVar67 * 2) = uVar99;
          uVar60 = vmovlps_avx(auVar72);
          auStack_58[uVar67] = uVar60;
          uVar65 = uVar65 + 1;
        }
      }
    }
    _local_508 = auVar18;
    if (uVar65 != 0) {
      do {
        auVar247 = ZEXT1664(local_4e8);
        auVar239 = ZEXT1664(local_4d8);
        auVar187 = ZEXT1664(local_4c8);
        uVar67 = (ulong)(uVar65 - 1);
        uVar63 = auStack_2d8[uVar67];
        uVar64 = (&uStack_1b8)[uVar67 * 2];
        fVar68 = afStack_1b4[uVar67 * 2];
        iVar20 = 0;
        for (uVar60 = (ulong)uVar63; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          iVar20 = iVar20 + 1;
        }
        uVar63 = uVar63 - 1 & uVar63;
        if (uVar63 == 0) {
          uVar65 = uVar65 - 1;
        }
        auVar250._8_8_ = 0;
        auVar250._0_8_ = auStack_58[uVar67];
        auVar258 = ZEXT1664(auVar250);
        auStack_2d8[uVar67] = uVar63;
        fVar96 = (float)(iVar20 + 1) * 0.14285715;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * (float)iVar20 * 0.14285715)),
                                  ZEXT416(uVar64),ZEXT416((uint)(1.0 - (float)iVar20 * 0.14285715)))
        ;
        auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar96)),ZEXT416(uVar64),
                                 ZEXT416((uint)(1.0 - fVar96)));
        fVar96 = auVar4._0_4_;
        auVar201._0_4_ = auVar12._0_4_;
        fVar68 = fVar96 - auVar201._0_4_;
        if (0.16666667 <= fVar68) {
          auVar12 = vinsertps_avx(auVar12,auVar4,0x10);
          auVar269 = ZEXT1664(auVar12);
          auVar214 = ZEXT1664(local_3c8);
          auVar170 = ZEXT1664(local_3d8);
          auVar202 = ZEXT1664(local_3e8);
          auVar226 = ZEXT1664(local_3f8);
          auVar151 = ZEXT1664(_local_408);
          goto LAB_017f8e0f;
        }
        auVar136 = vshufps_avx(auVar250,auVar250,0x50);
        auVar103._8_4_ = 0x3f800000;
        auVar103._0_8_ = 0x3f8000003f800000;
        auVar103._12_4_ = 0x3f800000;
        auVar5 = vsubps_avx(auVar103,auVar136);
        fVar129 = auVar136._0_4_;
        auVar145._0_4_ = fVar129 * (float)local_408._0_4_;
        fVar97 = auVar136._4_4_;
        auVar145._4_4_ = fVar97 * (float)local_408._4_4_;
        fVar98 = auVar136._8_4_;
        auVar145._8_4_ = fVar98 * fStack_400;
        fVar70 = auVar136._12_4_;
        auVar145._12_4_ = fVar70 * fStack_3fc;
        auVar158._0_4_ = local_4c8._0_4_ * fVar129;
        auVar158._4_4_ = local_4c8._4_4_ * fVar97;
        auVar158._8_4_ = local_4c8._8_4_ * fVar98;
        auVar158._12_4_ = local_4c8._12_4_ * fVar70;
        auVar183._0_4_ = local_4d8._0_4_ * fVar129;
        auVar183._4_4_ = local_4d8._4_4_ * fVar97;
        auVar183._8_4_ = local_4d8._8_4_ * fVar98;
        auVar183._12_4_ = local_4d8._12_4_ * fVar70;
        auVar82._0_4_ = local_4e8._0_4_ * fVar129;
        auVar82._4_4_ = local_4e8._4_4_ * fVar97;
        auVar82._8_4_ = local_4e8._8_4_ * fVar98;
        auVar82._12_4_ = local_4e8._12_4_ * fVar70;
        auVar136 = vfmadd231ps_fma(auVar145,auVar5,local_3c8);
        auVar6 = vfmadd231ps_fma(auVar158,auVar5,local_3d8);
        auVar251 = vfmadd231ps_fma(auVar183,auVar5,local_3e8);
        auVar5 = vfmadd231ps_fma(auVar82,auVar5,local_3f8);
        auVar141._16_16_ = auVar136;
        auVar141._0_16_ = auVar136;
        auVar150._16_16_ = auVar6;
        auVar150._0_16_ = auVar6;
        auVar169._16_16_ = auVar251;
        auVar169._0_16_ = auVar251;
        _local_508 = auVar12;
        auVar201._4_4_ = auVar201._0_4_;
        auVar201._8_4_ = auVar201._0_4_;
        auVar201._12_4_ = auVar201._0_4_;
        auVar201._20_4_ = fVar96;
        auVar201._16_4_ = fVar96;
        auVar201._24_4_ = fVar96;
        auVar201._28_4_ = fVar96;
        auVar92 = vsubps_avx(auVar150,auVar141);
        auVar6 = vfmadd213ps_fma(auVar92,auVar201,auVar141);
        auVar92 = vsubps_avx(auVar169,auVar150);
        auVar160 = vfmadd213ps_fma(auVar92,auVar201,auVar150);
        auVar136 = vsubps_avx(auVar5,auVar251);
        auVar94._16_16_ = auVar136;
        auVar94._0_16_ = auVar136;
        auVar136 = vfmadd213ps_fma(auVar94,auVar201,auVar169);
        auVar92 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar6));
        auVar5 = vfmadd213ps_fma(auVar92,auVar201,ZEXT1632(auVar6));
        auVar92 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar160));
        auVar136 = vfmadd213ps_fma(auVar92,auVar201,ZEXT1632(auVar160));
        auVar92 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar5));
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar92,auVar201);
        fVar227 = auVar92._4_4_ * 3.0;
        local_328._0_4_ = fVar68;
        fVar129 = fVar68 * 0.33333334;
        local_218._0_8_ =
             CONCAT44(auVar71._4_4_ + fVar129 * fVar227,
                      auVar71._0_4_ + fVar129 * auVar92._0_4_ * 3.0);
        local_218._8_4_ = auVar71._8_4_ + fVar129 * auVar92._8_4_ * 3.0;
        local_218._12_4_ = auVar71._12_4_ + fVar129 * auVar92._12_4_ * 3.0;
        auVar5 = vshufpd_avx(auVar71,auVar71,3);
        auVar6 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_2f8 = auVar5;
        auVar136 = vsubps_avx(auVar5,auVar71);
        _local_348 = auVar6;
        auVar251 = vsubps_avx(auVar6,(undefined1  [16])0x0);
        auVar83._0_4_ = auVar136._0_4_ + auVar251._0_4_;
        auVar83._4_4_ = auVar136._4_4_ + auVar251._4_4_;
        auVar83._8_4_ = auVar136._8_4_ + auVar251._8_4_;
        auVar83._12_4_ = auVar136._12_4_ + auVar251._12_4_;
        auVar136 = vshufps_avx(auVar71,auVar71,0xb1);
        auVar251 = vshufps_avx(local_218._0_16_,local_218._0_16_,0xb1);
        auVar271._4_4_ = auVar83._0_4_;
        auVar271._0_4_ = auVar83._0_4_;
        auVar271._8_4_ = auVar83._0_4_;
        auVar271._12_4_ = auVar83._0_4_;
        auVar160 = vshufps_avx(auVar83,auVar83,0x55);
        fVar97 = auVar160._0_4_;
        auVar84._0_4_ = fVar97 * auVar136._0_4_;
        fVar98 = auVar160._4_4_;
        auVar84._4_4_ = fVar98 * auVar136._4_4_;
        fVar70 = auVar160._8_4_;
        auVar84._8_4_ = fVar70 * auVar136._8_4_;
        fVar153 = auVar160._12_4_;
        auVar84._12_4_ = fVar153 * auVar136._12_4_;
        auVar159._0_4_ = fVar97 * auVar251._0_4_;
        auVar159._4_4_ = fVar98 * auVar251._4_4_;
        auVar159._8_4_ = fVar70 * auVar251._8_4_;
        auVar159._12_4_ = fVar153 * auVar251._12_4_;
        auVar135 = vfmadd231ps_fma(auVar84,auVar271,auVar71);
        auVar242 = vfmadd231ps_fma(auVar159,auVar271,local_218._0_16_);
        auVar251 = vshufps_avx(auVar135,auVar135,0xe8);
        auVar160 = vshufps_avx(auVar242,auVar242,0xe8);
        auVar136 = vcmpps_avx(auVar251,auVar160,1);
        uVar64 = vextractps_avx(auVar136,0);
        auVar189 = auVar242;
        if ((uVar64 & 1) == 0) {
          auVar189 = auVar135;
        }
        local_3b8._0_16_ = auVar4;
        auVar131._0_4_ = fVar129 * auVar92._16_4_ * 3.0;
        auVar131._4_4_ = fVar129 * fVar227;
        auVar131._8_4_ = fVar129 * auVar92._24_4_ * 3.0;
        auVar131._12_4_ = fVar129 * auVar151._28_4_;
        auVar74 = vsubps_avx((undefined1  [16])0x0,auVar131);
        auVar132 = vshufps_avx(auVar74,auVar74,0xb1);
        auVar270 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar192._0_4_ = fVar97 * auVar132._0_4_;
        auVar192._4_4_ = fVar98 * auVar132._4_4_;
        auVar192._8_4_ = fVar70 * auVar132._8_4_;
        auVar192._12_4_ = fVar153 * auVar132._12_4_;
        auVar209._0_4_ = auVar270._0_4_ * fVar97;
        auVar209._4_4_ = auVar270._4_4_ * fVar98;
        auVar209._8_4_ = auVar270._8_4_ * fVar70;
        auVar209._12_4_ = auVar270._12_4_ * fVar153;
        auVar73 = vfmadd231ps_fma(auVar192,auVar271,auVar74);
        auVar21 = vfmadd231ps_fma(auVar209,(undefined1  [16])0x0,auVar271);
        auVar270 = vshufps_avx(auVar73,auVar73,0xe8);
        auVar72 = vshufps_avx(auVar21,auVar21,0xe8);
        auVar151 = ZEXT1664(auVar72);
        auVar132 = vcmpps_avx(auVar270,auVar72,1);
        uVar64 = vextractps_avx(auVar132,0);
        auVar75 = auVar21;
        if ((uVar64 & 1) == 0) {
          auVar75 = auVar73;
        }
        auVar189 = vmaxss_avx(auVar75,auVar189);
        auVar251 = vminps_avx(auVar251,auVar160);
        auVar160 = vminps_avx(auVar270,auVar72);
        auVar160 = vminps_avx(auVar251,auVar160);
        auVar136 = vshufps_avx(auVar136,auVar136,0x55);
        auVar136 = vblendps_avx(auVar136,auVar132,2);
        auVar132 = vpslld_avx(auVar136,0x1f);
        auVar136 = vshufpd_avx(auVar242,auVar242,1);
        auVar136 = vinsertps_avx(auVar136,auVar21,0x9c);
        auVar251 = vshufpd_avx(auVar135,auVar135,1);
        auVar251 = vinsertps_avx(auVar251,auVar73,0x9c);
        auVar136 = vblendvps_avx(auVar251,auVar136,auVar132);
        auVar251 = vmovshdup_avx(auVar136);
        auVar136 = vmaxss_avx(auVar251,auVar136);
        fVar70 = auVar160._0_4_;
        auVar251 = vmovshdup_avx(auVar160);
        fVar98 = auVar136._0_4_;
        fVar129 = auVar251._0_4_;
        fVar97 = auVar189._0_4_;
        if (((fVar70 < 0.0001) && (-0.0001 < fVar98)) || (fVar129 < 0.0001 && -0.0001 < fVar98)) {
LAB_017f96c3:
          auVar151 = ZEXT1664(auVar74);
          auVar135 = vcmpps_avx(auVar160,_DAT_01f7aa10,1);
          auVar242 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar251 = vcmpss_avx(auVar189,ZEXT816(0) << 0x20,1);
          auVar104._8_4_ = 0x3f800000;
          auVar104._0_8_ = 0x3f8000003f800000;
          auVar104._12_4_ = 0x3f800000;
          auVar119._8_4_ = 0xbf800000;
          auVar119._0_8_ = 0xbf800000bf800000;
          auVar119._12_4_ = 0xbf800000;
          auVar251 = vblendvps_avx(auVar104,auVar119,auVar251);
          auVar135 = vblendvps_avx(auVar104,auVar119,auVar135);
          fVar227 = auVar135._0_4_;
          fVar153 = auVar251._0_4_;
          auVar251 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar227 == fVar153) && (!NAN(fVar227) && !NAN(fVar153))) {
            auVar251 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar227 == fVar153) && (!NAN(fVar227) && !NAN(fVar153))) {
            auVar242 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar135 = vmovshdup_avx(auVar135);
          fVar188 = auVar135._0_4_;
          if ((fVar227 != fVar188) || (NAN(fVar227) || NAN(fVar188))) {
            if ((fVar129 != fVar70) || (NAN(fVar129) || NAN(fVar70))) {
              auVar133._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
              auVar133._8_4_ = auVar160._8_4_ ^ 0x80000000;
              auVar133._12_4_ = auVar160._12_4_ ^ 0x80000000;
              auVar134._0_4_ = -fVar70 / (fVar129 - fVar70);
              auVar134._4_12_ = auVar133._4_12_;
              auVar160 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar134._0_4_)),auVar134,ZEXT416(0));
              auVar135 = auVar160;
            }
            else {
              auVar160 = ZEXT816(0) << 0x20;
              if ((fVar70 != 0.0) || (auVar135 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar70))) {
                auVar160 = SUB6416(ZEXT464(0x7f800000),0);
                auVar135 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar251 = vminss_avx(auVar251,auVar160);
            auVar242 = vmaxss_avx(auVar135,auVar242);
          }
          auVar136 = vcmpss_avx(auVar136,ZEXT416(0),1);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar120._8_4_ = 0xbf800000;
          auVar120._0_8_ = 0xbf800000bf800000;
          auVar120._12_4_ = 0xbf800000;
          auVar136 = vblendvps_avx(auVar105,auVar120,auVar136);
          fVar129 = auVar136._0_4_;
          if ((fVar153 != fVar129) || (NAN(fVar153) || NAN(fVar129))) {
            if ((fVar98 != fVar97) || (NAN(fVar98) || NAN(fVar97))) {
              auVar85._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
              auVar85._8_4_ = auVar189._8_4_ ^ 0x80000000;
              auVar85._12_4_ = auVar189._12_4_ ^ 0x80000000;
              auVar137._0_4_ = -fVar97 / (fVar98 - fVar97);
              auVar137._4_12_ = auVar85._4_12_;
              auVar136 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar137._0_4_)),auVar137,ZEXT416(0));
              auVar160 = auVar136;
            }
            else {
              auVar136 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar97 != 0.0) || (auVar160 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar97))) {
                auVar136 = SUB6416(ZEXT464(0xff800000),0);
                auVar160 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar251 = vminss_avx(auVar251,auVar160);
            auVar242 = vmaxss_avx(auVar136,auVar242);
          }
          if ((fVar188 != fVar129) || (NAN(fVar188) || NAN(fVar129))) {
            auVar251 = vminss_avx(auVar251,SUB6416(ZEXT464(0x3f800000),0));
            auVar242 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar242);
          }
          auVar136 = vmaxss_avx(ZEXT816(0) << 0x40,auVar251);
          auVar251 = vminss_avx(auVar242,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar136._0_4_ <= auVar251._0_4_) {
            auVar136 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar136._0_4_ + -0.1)));
            auVar251 = vminss_avx(ZEXT416((uint)(auVar251._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar146._0_8_ = auVar71._0_8_;
            auVar146._8_8_ = auVar146._0_8_;
            auVar217._8_8_ = local_218._0_8_;
            auVar217._0_8_ = local_218._0_8_;
            auVar231._8_8_ = auVar74._0_8_;
            auVar231._0_8_ = auVar74._0_8_;
            auVar160 = vshufpd_avx(local_218._0_16_,local_218._0_16_,3);
            auVar135 = vshufpd_avx(auVar74,auVar74,3);
            auVar242 = vshufps_avx(auVar136,auVar251,0);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = 0x3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar71 = vsubps_avx(auVar86,auVar242);
            local_2f8._0_4_ = auVar5._0_4_;
            local_2f8._4_4_ = auVar5._4_4_;
            fStack_2f0 = auVar5._8_4_;
            fStack_2ec = auVar5._12_4_;
            fVar129 = auVar242._0_4_;
            auVar87._0_4_ = fVar129 * (float)local_2f8._0_4_;
            fVar97 = auVar242._4_4_;
            auVar87._4_4_ = fVar97 * (float)local_2f8._4_4_;
            fVar98 = auVar242._8_4_;
            auVar87._8_4_ = fVar98 * fStack_2f0;
            fVar70 = auVar242._12_4_;
            auVar87._12_4_ = fVar70 * fStack_2ec;
            auVar184._0_4_ = fVar129 * auVar160._0_4_;
            auVar184._4_4_ = fVar97 * auVar160._4_4_;
            auVar184._8_4_ = fVar98 * auVar160._8_4_;
            auVar184._12_4_ = fVar70 * auVar160._12_4_;
            auVar193._0_4_ = fVar129 * auVar135._0_4_;
            auVar193._4_4_ = fVar97 * auVar135._4_4_;
            auVar193._8_4_ = fVar98 * auVar135._8_4_;
            auVar193._12_4_ = fVar70 * auVar135._12_4_;
            local_348._0_4_ = auVar6._0_4_;
            local_348._4_4_ = auVar6._4_4_;
            fStack_340 = auVar6._8_4_;
            fStack_33c = auVar6._12_4_;
            auVar210._0_4_ = fVar129 * (float)local_348._0_4_;
            auVar210._4_4_ = fVar97 * (float)local_348._4_4_;
            auVar210._8_4_ = fVar98 * fStack_340;
            auVar210._12_4_ = fVar70 * fStack_33c;
            auVar160 = vfmadd231ps_fma(auVar87,auVar71,auVar146);
            auVar135 = vfmadd231ps_fma(auVar184,auVar71,auVar217);
            auVar242 = vfmadd231ps_fma(auVar193,auVar71,auVar231);
            auVar71 = vfmadd231ps_fma(auVar210,auVar71,ZEXT816(0));
            auVar5 = vmovshdup_avx(auVar250);
            auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar136._0_4_)),auVar250,
                                      ZEXT416((uint)(1.0 - auVar136._0_4_)));
            auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar251._0_4_)),auVar250,
                                      ZEXT416((uint)(1.0 - auVar251._0_4_)));
            fVar129 = 1.0 / fVar68;
            auVar136 = vsubps_avx(auVar135,auVar160);
            auVar218._0_4_ = auVar136._0_4_ * 3.0;
            auVar218._4_4_ = auVar136._4_4_ * 3.0;
            auVar218._8_4_ = auVar136._8_4_ * 3.0;
            auVar218._12_4_ = auVar136._12_4_ * 3.0;
            auVar136 = vsubps_avx(auVar242,auVar135);
            auVar232._0_4_ = auVar136._0_4_ * 3.0;
            auVar232._4_4_ = auVar136._4_4_ * 3.0;
            auVar232._8_4_ = auVar136._8_4_ * 3.0;
            auVar232._12_4_ = auVar136._12_4_ * 3.0;
            auVar136 = vsubps_avx(auVar71,auVar242);
            auVar243._0_4_ = auVar136._0_4_ * 3.0;
            auVar243._4_4_ = auVar136._4_4_ * 3.0;
            auVar243._8_4_ = auVar136._8_4_ * 3.0;
            auVar243._12_4_ = auVar136._12_4_ * 3.0;
            auVar5 = vminps_avx(auVar232,auVar243);
            auVar136 = vmaxps_avx(auVar232,auVar243);
            auVar5 = vminps_avx(auVar218,auVar5);
            auVar136 = vmaxps_avx(auVar218,auVar136);
            auVar6 = vshufpd_avx(auVar5,auVar5,3);
            auVar251 = vshufpd_avx(auVar136,auVar136,3);
            auVar5 = vminps_avx(auVar5,auVar6);
            auVar136 = vmaxps_avx(auVar136,auVar251);
            auVar233._0_4_ = auVar5._0_4_ * fVar129;
            auVar233._4_4_ = auVar5._4_4_ * fVar129;
            auVar233._8_4_ = auVar5._8_4_ * fVar129;
            auVar233._12_4_ = auVar5._12_4_ * fVar129;
            auVar219._0_4_ = auVar136._0_4_ * fVar129;
            auVar219._4_4_ = auVar136._4_4_ * fVar129;
            auVar219._8_4_ = auVar136._8_4_ * fVar129;
            auVar219._12_4_ = auVar136._12_4_ * fVar129;
            fVar129 = 1.0 / (auVar73._0_4_ - auVar74._0_4_);
            auVar136 = vshufpd_avx(auVar160,auVar160,3);
            auVar5 = vshufpd_avx(auVar135,auVar135,3);
            auVar6 = vshufpd_avx(auVar242,auVar242,3);
            auVar251 = vshufpd_avx(auVar71,auVar71,3);
            auVar136 = vsubps_avx(auVar136,auVar160);
            auVar160 = vsubps_avx(auVar5,auVar135);
            auVar135 = vsubps_avx(auVar6,auVar242);
            auVar251 = vsubps_avx(auVar251,auVar71);
            auVar5 = vminps_avx(auVar136,auVar160);
            auVar136 = vmaxps_avx(auVar136,auVar160);
            auVar6 = vminps_avx(auVar135,auVar251);
            auVar6 = vminps_avx(auVar5,auVar6);
            auVar5 = vmaxps_avx(auVar135,auVar251);
            auVar136 = vmaxps_avx(auVar136,auVar5);
            auVar263._0_4_ = fVar129 * auVar6._0_4_;
            auVar263._4_4_ = fVar129 * auVar6._4_4_;
            auVar263._8_4_ = fVar129 * auVar6._8_4_;
            auVar263._12_4_ = fVar129 * auVar6._12_4_;
            auVar252._0_4_ = fVar129 * auVar136._0_4_;
            auVar252._4_4_ = fVar129 * auVar136._4_4_;
            auVar252._8_4_ = fVar129 * auVar136._8_4_;
            auVar252._12_4_ = fVar129 * auVar136._12_4_;
            auVar251 = vinsertps_avx(auVar12,auVar74,0x10);
            auVar160 = vinsertps_avx(auVar4,auVar73,0x10);
            auVar244._0_4_ = (auVar251._0_4_ + auVar160._0_4_) * 0.5;
            auVar244._4_4_ = (auVar251._4_4_ + auVar160._4_4_) * 0.5;
            auVar244._8_4_ = (auVar251._8_4_ + auVar160._8_4_) * 0.5;
            auVar244._12_4_ = (auVar251._12_4_ + auVar160._12_4_) * 0.5;
            auVar88._4_4_ = auVar244._0_4_;
            auVar88._0_4_ = auVar244._0_4_;
            auVar88._8_4_ = auVar244._0_4_;
            auVar88._12_4_ = auVar244._0_4_;
            auVar136 = vfmadd213ps_fma(local_228,auVar88,local_498);
            auVar5 = vfmadd213ps_fma(local_238,auVar88,local_518);
            auVar6 = vfmadd213ps_fma(local_248,auVar88,local_488);
            auVar4 = vsubps_avx(auVar5,auVar136);
            auVar136 = vfmadd213ps_fma(auVar4,auVar88,auVar136);
            auVar4 = vsubps_avx(auVar6,auVar5);
            auVar4 = vfmadd213ps_fma(auVar4,auVar88,auVar5);
            auVar4 = vsubps_avx(auVar4,auVar136);
            auVar136 = vfmadd231ps_fma(auVar136,auVar4,auVar88);
            auVar89._0_8_ = CONCAT44(auVar4._4_4_ * 3.0,auVar4._0_4_ * 3.0);
            auVar89._8_4_ = auVar4._8_4_ * 3.0;
            auVar89._12_4_ = auVar4._12_4_ * 3.0;
            auVar272._8_8_ = auVar136._0_8_;
            auVar272._0_8_ = auVar136._0_8_;
            auVar4 = vshufpd_avx(auVar136,auVar136,3);
            auVar136 = vshufps_avx(auVar244,auVar244,0x55);
            auVar242 = vsubps_avx(auVar4,auVar272);
            auVar189 = vfmadd231ps_fma(auVar272,auVar136,auVar242);
            auVar280._8_8_ = auVar89._0_8_;
            auVar280._0_8_ = auVar89._0_8_;
            auVar4 = vshufpd_avx(auVar89,auVar89,3);
            auVar4 = vsubps_avx(auVar4,auVar280);
            auVar71 = vfmadd213ps_fma(auVar4,auVar136,auVar280);
            auVar136 = vmovshdup_avx(auVar71);
            auVar281._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
            auVar281._8_4_ = auVar136._8_4_ ^ 0x80000000;
            auVar281._12_4_ = auVar136._12_4_ ^ 0x80000000;
            auVar5 = vmovshdup_avx(auVar242);
            auVar4 = vunpcklps_avx(auVar5,auVar281);
            auVar6 = vshufps_avx(auVar4,auVar281,4);
            auVar135 = vshufps_avx(auVar244,auVar244,0x54);
            auVar138._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
            auVar138._8_4_ = auVar242._8_4_ ^ 0x80000000;
            auVar138._12_4_ = auVar242._12_4_ ^ 0x80000000;
            auVar4 = vmovlhps_avx(auVar138,auVar71);
            auVar4 = vshufps_avx(auVar4,auVar71,8);
            auVar136 = vfmsub231ss_fma(ZEXT416((uint)(auVar242._0_4_ * auVar136._0_4_)),auVar5,
                                       auVar71);
            uVar69 = auVar136._0_4_;
            auVar90._4_4_ = uVar69;
            auVar90._0_4_ = uVar69;
            auVar90._8_4_ = uVar69;
            auVar90._12_4_ = uVar69;
            auVar136 = vdivps_avx(auVar6,auVar90);
            auVar5 = vdivps_avx(auVar4,auVar90);
            fVar98 = auVar189._0_4_;
            fVar129 = auVar136._0_4_;
            auVar4 = vshufps_avx(auVar189,auVar189,0x55);
            fVar97 = auVar5._0_4_;
            auVar91._0_4_ = fVar98 * fVar129 + auVar4._0_4_ * fVar97;
            auVar91._4_4_ = fVar98 * auVar136._4_4_ + auVar4._4_4_ * auVar5._4_4_;
            auVar91._8_4_ = fVar98 * auVar136._8_4_ + auVar4._8_4_ * auVar5._8_4_;
            auVar91._12_4_ = fVar98 * auVar136._12_4_ + auVar4._12_4_ * auVar5._12_4_;
            auVar72 = vsubps_avx(auVar135,auVar91);
            auVar135 = vmovshdup_avx(auVar136);
            auVar4 = vinsertps_avx(auVar233,auVar263,0x1c);
            auVar161._0_4_ = auVar135._0_4_ * auVar4._0_4_;
            auVar161._4_4_ = auVar135._4_4_ * auVar4._4_4_;
            auVar161._8_4_ = auVar135._8_4_ * auVar4._8_4_;
            auVar161._12_4_ = auVar135._12_4_ * auVar4._12_4_;
            auVar6 = vinsertps_avx(auVar219,auVar252,0x1c);
            auVar106._0_4_ = auVar6._0_4_ * auVar135._0_4_;
            auVar106._4_4_ = auVar6._4_4_ * auVar135._4_4_;
            auVar106._8_4_ = auVar6._8_4_ * auVar135._8_4_;
            auVar106._12_4_ = auVar6._12_4_ * auVar135._12_4_;
            auVar189 = vminps_avx(auVar161,auVar106);
            auVar71 = vmaxps_avx(auVar106,auVar161);
            auVar135 = vinsertps_avx(auVar263,auVar233,0x4c);
            auVar132 = vmovshdup_avx(auVar5);
            auVar242 = vinsertps_avx(auVar252,auVar219,0x4c);
            auVar253._0_4_ = auVar132._0_4_ * auVar135._0_4_;
            auVar253._4_4_ = auVar132._4_4_ * auVar135._4_4_;
            auVar253._8_4_ = auVar132._8_4_ * auVar135._8_4_;
            auVar253._12_4_ = auVar132._12_4_ * auVar135._12_4_;
            auVar234._0_4_ = auVar132._0_4_ * auVar242._0_4_;
            auVar234._4_4_ = auVar132._4_4_ * auVar242._4_4_;
            auVar234._8_4_ = auVar132._8_4_ * auVar242._8_4_;
            auVar234._12_4_ = auVar132._12_4_ * auVar242._12_4_;
            auVar132 = vminps_avx(auVar253,auVar234);
            auVar264._0_4_ = auVar189._0_4_ + auVar132._0_4_;
            auVar264._4_4_ = auVar189._4_4_ + auVar132._4_4_;
            auVar264._8_4_ = auVar189._8_4_ + auVar132._8_4_;
            auVar264._12_4_ = auVar189._12_4_ + auVar132._12_4_;
            auVar189 = vmaxps_avx(auVar234,auVar253);
            auVar107._0_4_ = auVar189._0_4_ + auVar71._0_4_;
            auVar107._4_4_ = auVar189._4_4_ + auVar71._4_4_;
            auVar107._8_4_ = auVar189._8_4_ + auVar71._8_4_;
            auVar107._12_4_ = auVar189._12_4_ + auVar71._12_4_;
            auVar235._8_8_ = 0x3f80000000000000;
            auVar235._0_8_ = 0x3f80000000000000;
            auVar71 = vsubps_avx(auVar235,auVar107);
            auVar189 = vsubps_avx(auVar235,auVar264);
            auVar132 = vsubps_avx(auVar251,auVar244);
            auVar270 = vsubps_avx(auVar160,auVar244);
            auVar121._0_4_ = fVar129 * auVar4._0_4_;
            auVar121._4_4_ = fVar129 * auVar4._4_4_;
            auVar121._8_4_ = fVar129 * auVar4._8_4_;
            auVar121._12_4_ = fVar129 * auVar4._12_4_;
            auVar265._0_4_ = fVar129 * auVar6._0_4_;
            auVar265._4_4_ = fVar129 * auVar6._4_4_;
            auVar265._8_4_ = fVar129 * auVar6._8_4_;
            auVar265._12_4_ = fVar129 * auVar6._12_4_;
            auVar6 = vminps_avx(auVar121,auVar265);
            auVar4 = vmaxps_avx(auVar265,auVar121);
            auVar162._0_4_ = fVar97 * auVar135._0_4_;
            auVar162._4_4_ = fVar97 * auVar135._4_4_;
            auVar162._8_4_ = fVar97 * auVar135._8_4_;
            auVar162._12_4_ = fVar97 * auVar135._12_4_;
            auVar220._0_4_ = fVar97 * auVar242._0_4_;
            auVar220._4_4_ = fVar97 * auVar242._4_4_;
            auVar220._8_4_ = fVar97 * auVar242._8_4_;
            auVar220._12_4_ = fVar97 * auVar242._12_4_;
            auVar135 = vminps_avx(auVar162,auVar220);
            auVar266._0_4_ = auVar6._0_4_ + auVar135._0_4_;
            auVar266._4_4_ = auVar6._4_4_ + auVar135._4_4_;
            auVar266._8_4_ = auVar6._8_4_ + auVar135._8_4_;
            auVar266._12_4_ = auVar6._12_4_ + auVar135._12_4_;
            fVar188 = auVar132._0_4_;
            auVar273._0_4_ = fVar188 * auVar71._0_4_;
            fVar203 = auVar132._4_4_;
            auVar273._4_4_ = fVar203 * auVar71._4_4_;
            fVar204 = auVar132._8_4_;
            auVar273._8_4_ = fVar204 * auVar71._8_4_;
            fVar205 = auVar132._12_4_;
            auVar273._12_4_ = fVar205 * auVar71._12_4_;
            auVar6 = vmaxps_avx(auVar220,auVar162);
            auVar221._0_4_ = fVar188 * auVar189._0_4_;
            auVar221._4_4_ = fVar203 * auVar189._4_4_;
            auVar221._8_4_ = fVar204 * auVar189._8_4_;
            auVar221._12_4_ = fVar205 * auVar189._12_4_;
            fVar98 = auVar270._0_4_;
            auVar108._0_4_ = fVar98 * auVar71._0_4_;
            fVar70 = auVar270._4_4_;
            auVar108._4_4_ = fVar70 * auVar71._4_4_;
            fVar153 = auVar270._8_4_;
            auVar108._8_4_ = fVar153 * auVar71._8_4_;
            fVar227 = auVar270._12_4_;
            auVar108._12_4_ = fVar227 * auVar71._12_4_;
            auVar236._0_4_ = fVar98 * auVar189._0_4_;
            auVar236._4_4_ = fVar70 * auVar189._4_4_;
            auVar236._8_4_ = fVar153 * auVar189._8_4_;
            auVar236._12_4_ = fVar227 * auVar189._12_4_;
            auVar122._0_4_ = auVar4._0_4_ + auVar6._0_4_;
            auVar122._4_4_ = auVar4._4_4_ + auVar6._4_4_;
            auVar122._8_4_ = auVar4._8_4_ + auVar6._8_4_;
            auVar122._12_4_ = auVar4._12_4_ + auVar6._12_4_;
            auVar163._8_8_ = 0x3f800000;
            auVar163._0_8_ = 0x3f800000;
            auVar4 = vsubps_avx(auVar163,auVar122);
            auVar6 = vsubps_avx(auVar163,auVar266);
            auVar267._0_4_ = fVar188 * auVar4._0_4_;
            auVar267._4_4_ = fVar203 * auVar4._4_4_;
            auVar267._8_4_ = fVar204 * auVar4._8_4_;
            auVar267._12_4_ = fVar205 * auVar4._12_4_;
            auVar254._0_4_ = fVar188 * auVar6._0_4_;
            auVar254._4_4_ = fVar203 * auVar6._4_4_;
            auVar254._8_4_ = fVar204 * auVar6._8_4_;
            auVar254._12_4_ = fVar205 * auVar6._12_4_;
            auVar123._0_4_ = fVar98 * auVar4._0_4_;
            auVar123._4_4_ = fVar70 * auVar4._4_4_;
            auVar123._8_4_ = fVar153 * auVar4._8_4_;
            auVar123._12_4_ = fVar227 * auVar4._12_4_;
            auVar164._0_4_ = fVar98 * auVar6._0_4_;
            auVar164._4_4_ = fVar70 * auVar6._4_4_;
            auVar164._8_4_ = fVar153 * auVar6._8_4_;
            auVar164._12_4_ = fVar227 * auVar6._12_4_;
            auVar4 = vminps_avx(auVar267,auVar254);
            auVar6 = vminps_avx(auVar123,auVar164);
            auVar4 = vminps_avx(auVar4,auVar6);
            auVar6 = vmaxps_avx(auVar254,auVar267);
            auVar135 = vmaxps_avx(auVar164,auVar123);
            auVar242 = vminps_avx(auVar273,auVar221);
            auVar71 = vminps_avx(auVar108,auVar236);
            auVar242 = vminps_avx(auVar242,auVar71);
            auVar4 = vhaddps_avx(auVar4,auVar242);
            auVar6 = vmaxps_avx(auVar135,auVar6);
            auVar135 = vmaxps_avx(auVar221,auVar273);
            auVar242 = vmaxps_avx(auVar236,auVar108);
            auVar135 = vmaxps_avx(auVar242,auVar135);
            auVar6 = vhaddps_avx(auVar6,auVar135);
            auVar4 = vshufps_avx(auVar4,auVar4,0xe8);
            auVar6 = vshufps_avx(auVar6,auVar6,0xe8);
            auVar237._0_4_ = auVar72._0_4_ + auVar4._0_4_;
            auVar237._4_4_ = auVar72._4_4_ + auVar4._4_4_;
            auVar237._8_4_ = auVar72._8_4_ + auVar4._8_4_;
            auVar237._12_4_ = auVar72._12_4_ + auVar4._12_4_;
            auVar222._0_4_ = auVar72._0_4_ + auVar6._0_4_;
            auVar222._4_4_ = auVar72._4_4_ + auVar6._4_4_;
            auVar222._8_4_ = auVar72._8_4_ + auVar6._8_4_;
            auVar222._12_4_ = auVar72._12_4_ + auVar6._12_4_;
            auVar151 = ZEXT1664(auVar222);
            auVar4 = vmaxps_avx(auVar251,auVar237);
            auVar54._4_4_ = uStack_304;
            auVar54._0_4_ = local_308;
            auVar54._8_4_ = uStack_300;
            auVar54._12_4_ = uStack_2fc;
            auVar6 = vminps_avx(auVar222,auVar160);
            auVar4 = vcmpps_avx(auVar6,auVar4,1);
            auVar4 = vshufps_avx(auVar4,auVar4,0x50);
            if ((auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar4[0xf]) {
              bVar62 = 0;
              if ((auVar201._0_4_ < auVar237._0_4_) && (bVar62 = 0, auVar222._0_4_ < auVar160._0_4_)
                 ) {
                auVar6 = vmovshdup_avx(auVar237);
                auVar4 = vcmpps_avx(auVar222,auVar160,1);
                bVar62 = auVar4[4] & auVar74._0_4_ < auVar6._0_4_;
              }
              if (((3 < uVar65 || fVar68 < 0.001) | bVar62) != 1) goto LAB_017fa248;
              lVar61 = 200;
              do {
                fVar70 = auVar72._0_4_;
                fVar98 = 1.0 - fVar70;
                fVar68 = fVar98 * fVar98 * fVar98;
                fVar96 = fVar70 * 3.0 * fVar98 * fVar98;
                fVar98 = fVar98 * fVar70 * fVar70 * 3.0;
                auVar147._4_4_ = fVar68;
                auVar147._0_4_ = fVar68;
                auVar147._8_4_ = fVar68;
                auVar147._12_4_ = fVar68;
                auVar124._4_4_ = fVar96;
                auVar124._0_4_ = fVar96;
                auVar124._8_4_ = fVar96;
                auVar124._12_4_ = fVar96;
                auVar109._4_4_ = fVar98;
                auVar109._0_4_ = fVar98;
                auVar109._8_4_ = fVar98;
                auVar109._12_4_ = fVar98;
                fVar70 = fVar70 * fVar70 * fVar70;
                auVar165._0_4_ = fVar70 * (float)local_388._0_4_;
                auVar165._4_4_ = fVar70 * (float)local_388._4_4_;
                auVar165._8_4_ = fVar70 * fStack_380;
                auVar165._12_4_ = fVar70 * fStack_37c;
                auVar12 = vfmadd231ps_fma(auVar165,auVar109,local_488);
                auVar12 = vfmadd231ps_fma(auVar12,auVar124,local_518);
                auVar12 = vfmadd231ps_fma(auVar12,local_498,auVar147);
                auVar110._8_8_ = auVar12._0_8_;
                auVar110._0_8_ = auVar12._0_8_;
                auVar12 = vshufpd_avx(auVar12,auVar12,3);
                auVar4 = vshufps_avx(auVar72,auVar72,0x55);
                auVar12 = vsubps_avx(auVar12,auVar110);
                auVar4 = vfmadd213ps_fma(auVar12,auVar4,auVar110);
                fVar68 = auVar4._0_4_;
                auVar12 = vshufps_avx(auVar4,auVar4,0x55);
                auVar111._0_4_ = fVar129 * fVar68 + fVar97 * auVar12._0_4_;
                auVar111._4_4_ = auVar136._4_4_ * fVar68 + auVar5._4_4_ * auVar12._4_4_;
                auVar111._8_4_ = auVar136._8_4_ * fVar68 + auVar5._8_4_ * auVar12._8_4_;
                auVar111._12_4_ = auVar136._12_4_ * fVar68 + auVar5._12_4_ * auVar12._12_4_;
                auVar72 = vsubps_avx(auVar72,auVar111);
                auVar12 = vandps_avx(auVar54,auVar4);
                auVar4 = vshufps_avx(auVar12,auVar12,0xf5);
                auVar12 = vmaxss_avx(auVar4,auVar12);
                if (auVar12._0_4_ < (float)local_398._0_4_) {
                  fVar68 = auVar72._0_4_;
                  if ((0.0 <= fVar68) && (fVar68 <= 1.0)) {
                    auVar12 = vmovshdup_avx(auVar72);
                    fVar96 = auVar12._0_4_;
                    if ((0.0 <= fVar96) && (fVar96 <= 1.0)) {
                      auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                              ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                              0x1c);
                      auVar135 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                     m128[2]),0x28);
                      aVar2 = (ray->super_RayK<1>).org.field_0;
                      auVar12 = vsubps_avx(local_418,(undefined1  [16])aVar2);
                      auVar12 = vdpps_avx(auVar12,auVar135,0x7f);
                      auVar4 = vsubps_avx(local_448,(undefined1  [16])aVar2);
                      auVar4 = vdpps_avx(auVar4,auVar135,0x7f);
                      auVar136 = vsubps_avx(local_458,(undefined1  [16])aVar2);
                      auVar136 = vdpps_avx(auVar136,auVar135,0x7f);
                      auVar5 = vsubps_avx(local_438,(undefined1  [16])aVar2);
                      auVar5 = vdpps_avx(auVar5,auVar135,0x7f);
                      auVar6 = vsubps_avx(_local_428,(undefined1  [16])aVar2);
                      auVar6 = vdpps_avx(auVar6,auVar135,0x7f);
                      auVar251 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
                      auVar251 = vdpps_avx(auVar251,auVar135,0x7f);
                      auVar160 = vsubps_avx(_local_478,(undefined1  [16])aVar2);
                      auVar160 = vdpps_avx(auVar160,auVar135,0x7f);
                      auVar53._4_4_ = fStack_4a4;
                      auVar53._0_4_ = local_4a8;
                      auVar53._8_4_ = fStack_4a0;
                      auVar53._12_4_ = fStack_49c;
                      auVar242 = vsubps_avx(auVar53,(undefined1  [16])aVar2);
                      auVar135 = vdpps_avx(auVar242,auVar135,0x7f);
                      fVar129 = 1.0 - fVar96;
                      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * fVar96)),
                                                ZEXT416((uint)fVar129),auVar12);
                      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar251._0_4_ * fVar96)),
                                               ZEXT416((uint)fVar129),auVar4);
                      auVar136 = vfmadd231ss_fma(ZEXT416((uint)(auVar160._0_4_ * fVar96)),
                                                 ZEXT416((uint)fVar129),auVar136);
                      auVar151 = ZEXT1664(auVar136);
                      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * auVar135._0_4_)),
                                               ZEXT416((uint)fVar129),auVar5);
                      fVar98 = 1.0 - fVar68;
                      fVar96 = fVar98 * fVar68 * fVar68 * 3.0;
                      fVar153 = fVar68 * fVar68 * fVar68;
                      auVar136 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * fVar153)),
                                                 ZEXT416((uint)fVar96),auVar136);
                      fVar129 = fVar68 * 3.0 * fVar98 * fVar98;
                      auVar4 = vfmadd231ss_fma(auVar136,ZEXT416((uint)fVar129),auVar4);
                      fVar97 = fVar98 * fVar98 * fVar98;
                      auVar12 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar97),auVar12);
                      fVar70 = auVar12._0_4_;
                      if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar70) &&
                          (fVar227 = (ray->super_RayK<1>).tfar, fVar70 <= fVar227)) &&
                         (pGVar8 = (context->scene->geometries).items[uVar59].ptr,
                         (pGVar8->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar12 = vshufps_avx(auVar72,auVar72,0x55);
                        auVar211._8_4_ = 0x3f800000;
                        auVar211._0_8_ = 0x3f8000003f800000;
                        auVar211._12_4_ = 0x3f800000;
                        auVar4 = vsubps_avx(auVar211,auVar12);
                        fVar188 = auVar12._0_4_;
                        auVar223._0_4_ = fVar188 * (float)local_428._0_4_;
                        fVar203 = auVar12._4_4_;
                        auVar223._4_4_ = fVar203 * (float)local_428._4_4_;
                        fVar204 = auVar12._8_4_;
                        auVar223._8_4_ = fVar204 * fStack_420;
                        fVar205 = auVar12._12_4_;
                        auVar223._12_4_ = fVar205 * fStack_41c;
                        auVar238._0_4_ = fVar188 * (float)local_468._0_4_;
                        auVar238._4_4_ = fVar203 * (float)local_468._4_4_;
                        auVar238._8_4_ = fVar204 * fStack_460;
                        auVar238._12_4_ = fVar205 * fStack_45c;
                        auVar245._0_4_ = fVar188 * (float)local_478._0_4_;
                        auVar245._4_4_ = fVar203 * (float)local_478._4_4_;
                        auVar245._8_4_ = fVar204 * fStack_470;
                        auVar245._12_4_ = fVar205 * fStack_46c;
                        auVar194._0_4_ = fVar188 * local_4a8;
                        auVar194._4_4_ = fVar203 * fStack_4a4;
                        auVar194._8_4_ = fVar204 * fStack_4a0;
                        auVar194._12_4_ = fVar205 * fStack_49c;
                        auVar12 = vfmadd231ps_fma(auVar223,auVar4,local_418);
                        auVar136 = vfmadd231ps_fma(auVar238,auVar4,local_448);
                        auVar5 = vfmadd231ps_fma(auVar245,auVar4,local_458);
                        auVar6 = vfmadd231ps_fma(auVar194,auVar4,local_438);
                        auVar12 = vsubps_avx(auVar136,auVar12);
                        auVar4 = vsubps_avx(auVar5,auVar136);
                        auVar151 = ZEXT1664(auVar4);
                        auVar136 = vsubps_avx(auVar6,auVar5);
                        auVar246._0_4_ = fVar68 * auVar4._0_4_;
                        auVar246._4_4_ = fVar68 * auVar4._4_4_;
                        auVar246._8_4_ = fVar68 * auVar4._8_4_;
                        auVar246._12_4_ = fVar68 * auVar4._12_4_;
                        auVar185._4_4_ = fVar98;
                        auVar185._0_4_ = fVar98;
                        auVar185._8_4_ = fVar98;
                        auVar185._12_4_ = fVar98;
                        auVar12 = vfmadd231ps_fma(auVar246,auVar185,auVar12);
                        auVar195._0_4_ = fVar68 * auVar136._0_4_;
                        auVar195._4_4_ = fVar68 * auVar136._4_4_;
                        auVar195._8_4_ = fVar68 * auVar136._8_4_;
                        auVar195._12_4_ = fVar68 * auVar136._12_4_;
                        auVar136 = vfmadd231ps_fma(auVar195,auVar185,auVar4);
                        auVar196._0_4_ = fVar68 * auVar136._0_4_;
                        auVar196._4_4_ = fVar68 * auVar136._4_4_;
                        auVar196._8_4_ = fVar68 * auVar136._8_4_;
                        auVar196._12_4_ = fVar68 * auVar136._12_4_;
                        auVar136 = vfmadd231ps_fma(auVar196,auVar185,auVar12);
                        auVar166._0_4_ = fVar153 * (float)local_298._0_4_;
                        auVar166._4_4_ = fVar153 * (float)local_298._4_4_;
                        auVar166._8_4_ = fVar153 * fStack_290;
                        auVar166._12_4_ = fVar153 * fStack_28c;
                        auVar125._4_4_ = fVar96;
                        auVar125._0_4_ = fVar96;
                        auVar125._8_4_ = fVar96;
                        auVar125._12_4_ = fVar96;
                        auVar12 = vfmadd132ps_fma(auVar125,auVar166,local_288);
                        auVar148._4_4_ = fVar129;
                        auVar148._0_4_ = fVar129;
                        auVar148._8_4_ = fVar129;
                        auVar148._12_4_ = fVar129;
                        auVar12 = vfmadd132ps_fma(auVar148,auVar12,local_278);
                        auVar167._0_4_ = auVar136._0_4_ * 3.0;
                        auVar167._4_4_ = auVar136._4_4_ * 3.0;
                        auVar167._8_4_ = auVar136._8_4_ * 3.0;
                        auVar167._12_4_ = auVar136._12_4_ * 3.0;
                        auVar139._4_4_ = fVar97;
                        auVar139._0_4_ = fVar97;
                        auVar139._8_4_ = fVar97;
                        auVar139._12_4_ = fVar97;
                        auVar136 = vfmadd132ps_fma(auVar139,auVar12,local_268);
                        auVar12 = vshufps_avx(auVar167,auVar167,0xc9);
                        auVar126._0_4_ = auVar136._0_4_ * auVar12._0_4_;
                        auVar126._4_4_ = auVar136._4_4_ * auVar12._4_4_;
                        auVar126._8_4_ = auVar136._8_4_ * auVar12._8_4_;
                        auVar126._12_4_ = auVar136._12_4_ * auVar12._12_4_;
                        auVar12 = vshufps_avx(auVar136,auVar136,0xc9);
                        auVar12 = vfmsub231ps_fma(auVar126,auVar167,auVar12);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar70;
                          auVar4 = vshufps_avx(auVar12,auVar12,0xe9);
                          uVar99 = vmovlps_avx(auVar4);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar99;
                          (ray->Ng).field_0.field_0.z = auVar12._0_4_;
                          uVar99 = vmovlps_avx(auVar72);
                          ray->u = (float)(int)uVar99;
                          ray->v = (float)(int)((ulong)uVar99 >> 0x20);
                          ray->primID = (uint)local_4b0;
                          ray->geomID = uVar59;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_508._0_4_ = fVar227;
                          auVar136 = vshufps_avx(auVar12,auVar12,0xe9);
                          local_2c8 = vmovlps_avx(auVar136);
                          local_2c0 = auVar12._0_4_;
                          local_2bc = vmovlps_avx(auVar72);
                          local_2b4 = (uint)local_4b0;
                          local_2b0 = uVar59;
                          local_2ac = context->user->instID[0];
                          local_2a8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar70;
                          local_51c = -1;
                          local_378.valid = &local_51c;
                          local_378.geometryUserPtr = pGVar8->userPtr;
                          local_378.context = context->user;
                          local_378.ray = (RTCRayN *)ray;
                          local_378.hit = (RTCHitN *)&local_2c8;
                          local_378.N = 1;
                          if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017fa0fc:
                            p_Var9 = context->args->filter;
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar151 = ZEXT1664(auVar151._0_16_);
                              (*p_Var9)(&local_378);
                              if (*local_378.valid == 0) goto LAB_017fa19f;
                            }
                            (((Vec3f *)((long)local_378.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_378.hit;
                            (((Vec3f *)((long)local_378.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_378.hit + 4);
                            (((Vec3f *)((long)local_378.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_378.hit + 8);
                            *(float *)((long)local_378.ray + 0x3c) = *(float *)(local_378.hit + 0xc)
                            ;
                            *(float *)((long)local_378.ray + 0x40) =
                                 *(float *)(local_378.hit + 0x10);
                            *(float *)((long)local_378.ray + 0x44) =
                                 *(float *)(local_378.hit + 0x14);
                            *(float *)((long)local_378.ray + 0x48) =
                                 *(float *)(local_378.hit + 0x18);
                            *(float *)((long)local_378.ray + 0x4c) =
                                 *(float *)(local_378.hit + 0x1c);
                            *(float *)((long)local_378.ray + 0x50) =
                                 *(float *)(local_378.hit + 0x20);
                          }
                          else {
                            auVar151 = ZEXT1664(auVar4);
                            (*pGVar8->intersectionFilterN)(&local_378);
                            if (*local_378.valid != 0) goto LAB_017fa0fc;
LAB_017fa19f:
                            (ray->super_RayK<1>).tfar = (float)local_508._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar61 = lVar61 + -1;
              } while (lVar61 != 0);
            }
          }
        }
        else {
          auVar251 = vcmpps_avx(auVar251,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar135 = vcmpps_avx(auVar160,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar251 = vandps_avx(auVar135,auVar251);
          if (-0.0001 < fVar97 && (auVar251 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_017f96c3;
        }
        if (uVar65 == 0) break;
      } while( true );
    }
    fVar68 = (ray->super_RayK<1>).tfar;
    auVar95._4_4_ = fVar68;
    auVar95._0_4_ = fVar68;
    auVar95._8_4_ = fVar68;
    auVar95._12_4_ = fVar68;
    auVar95._16_4_ = fVar68;
    auVar95._20_4_ = fVar68;
    auVar95._24_4_ = fVar68;
    auVar95._28_4_ = fVar68;
    auVar92 = vcmpps_avx(local_198,auVar95,2);
    uVar59 = vmovmskps_avx(auVar92);
    uVar59 = (uint)uVar66 & uVar59;
    if (uVar59 == 0) {
      return;
    }
  } while( true );
LAB_017fa248:
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar96),0x10);
  auVar269 = ZEXT1664(auVar12);
  auVar12 = vinsertps_avx(auVar74,ZEXT416((uint)auVar73._0_4_),0x10);
  auVar258 = ZEXT1664(auVar12);
  auVar214 = ZEXT1664(local_3c8);
  auVar170 = ZEXT1664(local_3d8);
  auVar202 = ZEXT1664(local_3e8);
  auVar226 = ZEXT1664(local_3f8);
  auVar151 = ZEXT1664(_local_408);
  auVar187 = ZEXT1664(local_4c8);
  auVar239 = ZEXT1664(local_4d8);
  auVar247 = ZEXT1664(local_4e8);
  goto LAB_017f8e0f;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }